

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  bool bVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  long lVar86;
  uint uVar87;
  ulong uVar88;
  bool bVar89;
  float fVar90;
  float fVar119;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar91;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar128;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar129;
  float fVar164;
  float fVar165;
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar146 [32];
  float fVar166;
  float fVar168;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 ai;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar202;
  float fVar203;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [28];
  float fVar205;
  float fVar208;
  float fVar209;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [64];
  float fVar210;
  float fVar226;
  float fVar227;
  vint4 bi;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar230;
  float fVar232;
  float fVar234;
  undefined1 auVar221 [28];
  float fVar229;
  float fVar231;
  undefined1 auVar222 [32];
  float fVar228;
  float fVar233;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar225 [32];
  float fVar235;
  float fVar236;
  float fVar253;
  float fVar255;
  vint4 ai_2;
  undefined1 auVar237 [16];
  float fVar257;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar275;
  float fVar278;
  undefined1 auVar265 [16];
  float fVar276;
  float fVar279;
  float fVar282;
  undefined1 auVar268 [32];
  float fVar277;
  float fVar280;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar289;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar281;
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar274 [64];
  float fVar290;
  float fVar302;
  float fVar303;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  float fVar305;
  undefined1 auVar296 [32];
  float fVar304;
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar301 [64];
  float fVar313;
  float fVar319;
  float fVar322;
  vint4 ai_1;
  undefined1 auVar316 [16];
  float fVar314;
  float fVar315;
  undefined1 auVar317 [16];
  float fVar320;
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar318 [32];
  float fVar337;
  float fVar344;
  float fVar345;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar347;
  float fVar349;
  float fVar351;
  undefined1 auVar341 [32];
  float fVar346;
  float fVar348;
  float fVar350;
  float fVar352;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [16];
  float fVar360;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar361;
  float fVar366;
  float fVar367;
  undefined1 auVar362 [16];
  undefined1 auVar363 [28];
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar373;
  float fVar380;
  float fVar381;
  undefined1 auVar374 [16];
  float fVar383;
  float fVar384;
  float fVar385;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar382;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  float fVar386;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  undefined1 auVar387 [32];
  float fVar396;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  float fVar397;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined1 (*local_a28) [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  ulong local_760;
  undefined1 auStack_758 [24];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680 [4];
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  RTCHitN local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar359 [64];
  
  PVar3 = prim[1];
  uVar83 = (ulong)(byte)PVar3;
  auVar132 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar235 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar132 = vsubps_avx(auVar132,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar143._0_4_ = fVar235 * auVar132._0_4_;
  auVar143._4_4_ = fVar235 * auVar132._4_4_;
  auVar143._8_4_ = fVar235 * auVar132._8_4_;
  auVar143._12_4_ = fVar235 * auVar132._12_4_;
  auVar291._0_4_ = fVar235 * auVar9._0_4_;
  auVar291._4_4_ = fVar235 * auVar9._4_4_;
  auVar291._8_4_ = fVar235 * auVar9._8_4_;
  auVar291._12_4_ = fVar235 * auVar9._12_4_;
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar294 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar294 = vcvtdq2ps_avx(auVar294);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar83 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar88 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + uVar83 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar88 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar92 = vshufps_avx(auVar291,auVar291,0);
  auVar130 = vshufps_avx(auVar291,auVar291,0x55);
  auVar136 = vshufps_avx(auVar291,auVar291,0xaa);
  fVar235 = auVar136._0_4_;
  fVar187 = auVar136._4_4_;
  fVar253 = auVar136._8_4_;
  fVar202 = auVar136._12_4_;
  fVar262 = auVar130._0_4_;
  fVar275 = auVar130._4_4_;
  fVar278 = auVar130._8_4_;
  fVar281 = auVar130._12_4_;
  fVar255 = auVar92._0_4_;
  fVar203 = auVar92._4_4_;
  fVar257 = auVar92._8_4_;
  fVar204 = auVar92._12_4_;
  auVar362._0_4_ = fVar255 * auVar132._0_4_ + fVar262 * auVar9._0_4_ + fVar235 * auVar137._0_4_;
  auVar362._4_4_ = fVar203 * auVar132._4_4_ + fVar275 * auVar9._4_4_ + fVar187 * auVar137._4_4_;
  auVar362._8_4_ = fVar257 * auVar132._8_4_ + fVar278 * auVar9._8_4_ + fVar253 * auVar137._8_4_;
  auVar362._12_4_ = fVar204 * auVar132._12_4_ + fVar281 * auVar9._12_4_ + fVar202 * auVar137._12_4_;
  auVar374._0_4_ = fVar255 * auVar12._0_4_ + fVar262 * auVar294._0_4_ + auVar13._0_4_ * fVar235;
  auVar374._4_4_ = fVar203 * auVar12._4_4_ + fVar275 * auVar294._4_4_ + auVar13._4_4_ * fVar187;
  auVar374._8_4_ = fVar257 * auVar12._8_4_ + fVar278 * auVar294._8_4_ + auVar13._8_4_ * fVar253;
  auVar374._12_4_ = fVar204 * auVar12._12_4_ + fVar281 * auVar294._12_4_ + auVar13._12_4_ * fVar202;
  auVar292._0_4_ = fVar255 * auVar96._0_4_ + fVar262 * auVar93._0_4_ + auVar131._0_4_ * fVar235;
  auVar292._4_4_ = fVar203 * auVar96._4_4_ + fVar275 * auVar93._4_4_ + auVar131._4_4_ * fVar187;
  auVar292._8_4_ = fVar257 * auVar96._8_4_ + fVar278 * auVar93._8_4_ + auVar131._8_4_ * fVar253;
  auVar292._12_4_ = fVar204 * auVar96._12_4_ + fVar281 * auVar93._12_4_ + auVar131._12_4_ * fVar202;
  auVar92 = vshufps_avx(auVar143,auVar143,0);
  auVar130 = vshufps_avx(auVar143,auVar143,0x55);
  auVar136 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar235 = auVar136._0_4_;
  fVar187 = auVar136._4_4_;
  fVar253 = auVar136._8_4_;
  fVar202 = auVar136._12_4_;
  fVar262 = auVar130._0_4_;
  fVar275 = auVar130._4_4_;
  fVar278 = auVar130._8_4_;
  fVar281 = auVar130._12_4_;
  fVar255 = auVar92._0_4_;
  fVar203 = auVar92._4_4_;
  fVar257 = auVar92._8_4_;
  fVar204 = auVar92._12_4_;
  auVar211._0_4_ = fVar255 * auVar132._0_4_ + fVar262 * auVar9._0_4_ + fVar235 * auVar137._0_4_;
  auVar211._4_4_ = fVar203 * auVar132._4_4_ + fVar275 * auVar9._4_4_ + fVar187 * auVar137._4_4_;
  auVar211._8_4_ = fVar257 * auVar132._8_4_ + fVar278 * auVar9._8_4_ + fVar253 * auVar137._8_4_;
  auVar211._12_4_ = fVar204 * auVar132._12_4_ + fVar281 * auVar9._12_4_ + fVar202 * auVar137._12_4_;
  auVar130._0_4_ = fVar255 * auVar12._0_4_ + auVar13._0_4_ * fVar235 + fVar262 * auVar294._0_4_;
  auVar130._4_4_ = fVar203 * auVar12._4_4_ + auVar13._4_4_ * fVar187 + fVar275 * auVar294._4_4_;
  auVar130._8_4_ = fVar257 * auVar12._8_4_ + auVar13._8_4_ * fVar253 + fVar278 * auVar294._8_4_;
  auVar130._12_4_ = fVar204 * auVar12._12_4_ + auVar13._12_4_ * fVar202 + fVar281 * auVar294._12_4_;
  auVar92._0_4_ = fVar255 * auVar96._0_4_ + fVar262 * auVar93._0_4_ + auVar131._0_4_ * fVar235;
  auVar92._4_4_ = fVar203 * auVar96._4_4_ + fVar275 * auVar93._4_4_ + auVar131._4_4_ * fVar187;
  auVar92._8_4_ = fVar257 * auVar96._8_4_ + fVar278 * auVar93._8_4_ + auVar131._8_4_ * fVar253;
  auVar92._12_4_ = fVar204 * auVar96._12_4_ + fVar281 * auVar93._12_4_ + auVar131._12_4_ * fVar202;
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar132 = vandps_avx(auVar362,auVar265);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar132 = vcmpps_avx(auVar132,auVar188,1);
  auVar9 = vblendvps_avx(auVar362,auVar188,auVar132);
  auVar132 = vandps_avx(auVar374,auVar265);
  auVar132 = vcmpps_avx(auVar132,auVar188,1);
  auVar137 = vblendvps_avx(auVar374,auVar188,auVar132);
  auVar132 = vandps_avx(auVar292,auVar265);
  auVar132 = vcmpps_avx(auVar132,auVar188,1);
  auVar132 = vblendvps_avx(auVar292,auVar188,auVar132);
  auVar12 = vrcpps_avx(auVar9);
  fVar262 = auVar12._0_4_;
  auVar136._0_4_ = fVar262 * auVar9._0_4_;
  fVar275 = auVar12._4_4_;
  auVar136._4_4_ = fVar275 * auVar9._4_4_;
  fVar278 = auVar12._8_4_;
  auVar136._8_4_ = fVar278 * auVar9._8_4_;
  fVar281 = auVar12._12_4_;
  auVar136._12_4_ = fVar281 * auVar9._12_4_;
  auVar293._8_4_ = 0x3f800000;
  auVar293._0_8_ = &DAT_3f8000003f800000;
  auVar293._12_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar293,auVar136);
  fVar262 = fVar262 + fVar262 * auVar9._0_4_;
  fVar275 = fVar275 + fVar275 * auVar9._4_4_;
  fVar278 = fVar278 + fVar278 * auVar9._8_4_;
  fVar281 = fVar281 + fVar281 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar137);
  fVar235 = auVar9._0_4_;
  auVar237._0_4_ = fVar235 * auVar137._0_4_;
  fVar253 = auVar9._4_4_;
  auVar237._4_4_ = fVar253 * auVar137._4_4_;
  fVar255 = auVar9._8_4_;
  auVar237._8_4_ = fVar255 * auVar137._8_4_;
  fVar257 = auVar9._12_4_;
  auVar237._12_4_ = fVar257 * auVar137._12_4_;
  auVar9 = vsubps_avx(auVar293,auVar237);
  fVar235 = fVar235 + fVar235 * auVar9._0_4_;
  fVar253 = fVar253 + fVar253 * auVar9._4_4_;
  fVar255 = fVar255 + fVar255 * auVar9._8_4_;
  fVar257 = fVar257 + fVar257 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar132);
  fVar187 = auVar9._0_4_;
  auVar189._0_4_ = fVar187 * auVar132._0_4_;
  fVar202 = auVar9._4_4_;
  auVar189._4_4_ = fVar202 * auVar132._4_4_;
  fVar203 = auVar9._8_4_;
  auVar189._8_4_ = fVar203 * auVar132._8_4_;
  fVar204 = auVar9._12_4_;
  auVar189._12_4_ = fVar204 * auVar132._12_4_;
  auVar132 = vsubps_avx(auVar293,auVar189);
  fVar187 = fVar187 + fVar187 * auVar132._0_4_;
  fVar202 = fVar202 + fVar202 * auVar132._4_4_;
  fVar203 = fVar203 + fVar203 * auVar132._8_4_;
  fVar204 = fVar204 + fVar204 * auVar132._12_4_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar132 = vpmovsxwd_avx(auVar132);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,auVar211);
  auVar172._0_4_ = fVar262 * auVar132._0_4_;
  auVar172._4_4_ = fVar275 * auVar132._4_4_;
  auVar172._8_4_ = fVar278 * auVar132._8_4_;
  auVar172._12_4_ = fVar281 * auVar132._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar132 = vpmovsxwd_avx(auVar9);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,auVar211);
  auVar212._0_4_ = fVar262 * auVar132._0_4_;
  auVar212._4_4_ = fVar275 * auVar132._4_4_;
  auVar212._8_4_ = fVar278 * auVar132._8_4_;
  auVar212._12_4_ = fVar281 * auVar132._12_4_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar137);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar83 * -2 + 6);
  auVar132 = vpmovsxwd_avx(auVar12);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,auVar130);
  auVar316._0_4_ = auVar132._0_4_ * fVar235;
  auVar316._4_4_ = auVar132._4_4_ * fVar253;
  auVar316._8_4_ = auVar132._8_4_ * fVar255;
  auVar316._12_4_ = auVar132._12_4_ * fVar257;
  auVar132 = vcvtdq2ps_avx(auVar9);
  auVar132 = vsubps_avx(auVar132,auVar130);
  auVar131._0_4_ = fVar235 * auVar132._0_4_;
  auVar131._4_4_ = fVar253 * auVar132._4_4_;
  auVar131._8_4_ = fVar255 * auVar132._8_4_;
  auVar131._12_4_ = fVar257 * auVar132._12_4_;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = *(ulong *)(prim + uVar88 + uVar83 + 6);
  auVar132 = vpmovsxwd_avx(auVar294);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,auVar92);
  auVar238._0_4_ = auVar132._0_4_ * fVar187;
  auVar238._4_4_ = auVar132._4_4_ * fVar202;
  auVar238._8_4_ = auVar132._8_4_ * fVar203;
  auVar238._12_4_ = auVar132._12_4_ * fVar204;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar132 = vpmovsxwd_avx(auVar13);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar132 = vsubps_avx(auVar132,auVar92);
  auVar96._0_4_ = auVar132._0_4_ * fVar187;
  auVar96._4_4_ = auVar132._4_4_ * fVar202;
  auVar96._8_4_ = auVar132._8_4_ * fVar203;
  auVar96._12_4_ = auVar132._12_4_ * fVar204;
  auVar132 = vpminsd_avx(auVar172,auVar212);
  auVar9 = vpminsd_avx(auVar316,auVar131);
  auVar132 = vmaxps_avx(auVar132,auVar9);
  auVar9 = vpminsd_avx(auVar238,auVar96);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar338._4_4_ = uVar1;
  auVar338._0_4_ = uVar1;
  auVar338._8_4_ = uVar1;
  auVar338._12_4_ = uVar1;
  auVar9 = vmaxps_avx(auVar9,auVar338);
  auVar132 = vmaxps_avx(auVar132,auVar9);
  local_630._0_4_ = auVar132._0_4_ * 0.99999964;
  local_630._4_4_ = auVar132._4_4_ * 0.99999964;
  local_630._8_4_ = auVar132._8_4_ * 0.99999964;
  local_630._12_4_ = auVar132._12_4_ * 0.99999964;
  auVar132 = vpmaxsd_avx(auVar172,auVar212);
  auVar9 = vpmaxsd_avx(auVar316,auVar131);
  auVar132 = vminps_avx(auVar132,auVar9);
  auVar9 = vpmaxsd_avx(auVar238,auVar96);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar173._4_4_ = uVar1;
  auVar173._0_4_ = uVar1;
  auVar173._8_4_ = uVar1;
  auVar173._12_4_ = uVar1;
  auVar9 = vminps_avx(auVar9,auVar173);
  auVar132 = vminps_avx(auVar132,auVar9);
  auVar93._0_4_ = auVar132._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar132._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar132._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar132._12_4_ * 1.0000004;
  auVar132 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar9 = vpcmpgtd_avx(auVar132,_DAT_01ff0cf0);
  auVar132 = vcmpps_avx(local_630,auVar93,2);
  auVar132 = vandps_avx(auVar132,auVar9);
  uVar82 = vmovmskps_avx(auVar132);
  if (uVar82 == 0) {
    return;
  }
  uVar82 = uVar82 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  uVar85 = 1 << ((byte)k & 0x1f);
  local_a28 = (undefined1 (*) [32])&local_540;
  local_a30 = (undefined8 *)(mm_lookupmask_ps + ((uVar85 & 0xf) << 4));
  local_a38 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar85 >> 4) * 0x10);
  local_910 = prim;
LAB_00f7eb5d:
  local_908 = (ulong)uVar82;
  lVar86 = 0;
  if (local_908 != 0) {
    for (; (uVar82 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
    }
  }
  local_908 = local_908 - 1 & local_908;
  uVar82 = *(uint *)(local_910 + 2);
  uVar85 = *(uint *)(local_910 + lVar86 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
  uVar88 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar85);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar86 = *(long *)&pGVar4[1].time_range.upper;
  auVar132 = *(undefined1 (*) [16])(lVar86 + (long)p_Var5 * uVar88);
  auVar9 = *(undefined1 (*) [16])(lVar86 + (uVar88 + 1) * (long)p_Var5);
  auVar137 = *(undefined1 (*) [16])(lVar86 + (uVar88 + 2) * (long)p_Var5);
  lVar8 = 0;
  if (local_908 != 0) {
    for (; (local_908 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar12 = *(undefined1 (*) [16])(lVar86 + (uVar88 + 3) * (long)p_Var5);
  if (((local_908 != 0) && (uVar88 = local_908 - 1 & local_908, uVar88 != 0)) &&
     (lVar86 = 0, uVar88 != 0)) {
    for (; (uVar88 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
    }
  }
  auVar294 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar13 = vinsertps_avx(auVar294,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar235 = *(float *)(ray + k * 4 + 0x80);
  auVar339._4_4_ = fVar235;
  auVar339._0_4_ = fVar235;
  auVar339._8_4_ = fVar235;
  auVar339._12_4_ = fVar235;
  fStack_830 = fVar235;
  _local_840 = auVar339;
  fStack_82c = fVar235;
  fStack_828 = fVar235;
  fStack_824 = fVar235;
  fVar187 = *(float *)(ray + k * 4 + 0xa0);
  auVar353._4_4_ = fVar187;
  auVar353._0_4_ = fVar187;
  auVar353._8_4_ = fVar187;
  auVar353._12_4_ = fVar187;
  fStack_850 = fVar187;
  _local_860 = auVar353;
  fStack_84c = fVar187;
  fStack_848 = fVar187;
  fStack_844 = fVar187;
  auVar294 = vunpcklps_avx(auVar339,auVar353);
  fVar253 = *(float *)(ray + k * 4 + 0xc0);
  auVar356._4_4_ = fVar253;
  auVar356._0_4_ = fVar253;
  auVar356._8_4_ = fVar253;
  auVar356._12_4_ = fVar253;
  fStack_870 = fVar253;
  _local_880 = auVar356;
  fStack_86c = fVar253;
  fStack_868 = fVar253;
  fStack_864 = fVar253;
  auVar359 = ZEXT3264(_local_880);
  _local_9b0 = vinsertps_avx(auVar294,auVar356,0x28);
  auVar94._0_4_ = (auVar132._0_4_ + auVar9._0_4_ + auVar137._0_4_ + auVar12._0_4_) * 0.25;
  auVar94._4_4_ = (auVar132._4_4_ + auVar9._4_4_ + auVar137._4_4_ + auVar12._4_4_) * 0.25;
  auVar94._8_4_ = (auVar132._8_4_ + auVar9._8_4_ + auVar137._8_4_ + auVar12._8_4_) * 0.25;
  auVar94._12_4_ = (auVar132._12_4_ + auVar9._12_4_ + auVar137._12_4_ + auVar12._12_4_) * 0.25;
  auVar294 = vsubps_avx(auVar94,auVar13);
  auVar294 = vdpps_avx(auVar294,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar96 = vrcpss_avx(local_9c0,local_9c0);
  fVar202 = auVar294._0_4_ * auVar96._0_4_ * (2.0 - local_9c0._0_4_ * auVar96._0_4_);
  auVar96 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
  auVar239._0_4_ = auVar13._0_4_ + local_9b0._0_4_ * auVar96._0_4_;
  auVar239._4_4_ = auVar13._4_4_ + local_9b0._4_4_ * auVar96._4_4_;
  auVar239._8_4_ = auVar13._8_4_ + local_9b0._8_4_ * auVar96._8_4_;
  auVar239._12_4_ = auVar13._12_4_ + local_9b0._12_4_ * auVar96._12_4_;
  auVar294 = vblendps_avx(auVar239,_DAT_01feba10,8);
  _local_ae0 = vsubps_avx(auVar132,auVar294);
  _local_af0 = vsubps_avx(auVar137,auVar294);
  auVar201 = ZEXT1664(_local_af0);
  _local_b00 = vsubps_avx(auVar9,auVar294);
  _local_b10 = vsubps_avx(auVar12,auVar294);
  auVar132 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001250 = auVar132;
  _local_1a0 = auVar132;
  auVar132 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001250 = auVar132;
  _local_1c0 = auVar132;
  auVar132 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001250 = auVar132;
  _local_1e0 = auVar132;
  auVar132 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar132;
  _local_200 = auVar132;
  auVar132 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001290 = auVar132;
  _local_220 = auVar132;
  auVar132 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001290 = auVar132;
  _local_240 = auVar132;
  auVar132 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar132;
  _local_260 = auVar132;
  auVar132 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar132;
  _local_280 = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar132;
  _local_2a0 = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar132;
  _local_2c0 = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar132;
  _local_2e0 = auVar132;
  auVar132 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar132;
  _local_300 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar132;
  _local_320 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar132;
  _local_340 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar132;
  _local_360 = auVar132;
  auVar132 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar132;
  _local_380 = auVar132;
  auVar132 = ZEXT416((uint)(fVar235 * fVar235 + fVar187 * fVar187 + fVar253 * fVar253));
  auVar132 = vshufps_avx(auVar132,auVar132,0);
  local_3a0._16_16_ = auVar132;
  local_3a0._0_16_ = auVar132;
  fVar235 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)fVar202);
  auVar132 = vshufps_avx(ZEXT416((uint)(fVar235 - fVar202)),ZEXT416((uint)(fVar235 - fVar202)),0);
  local_3c0._16_16_ = auVar132;
  local_3c0._0_16_ = auVar132;
  auVar132 = vshufps_avx(ZEXT416(uVar82),ZEXT416(uVar82),0);
  local_4e0._16_16_ = auVar132;
  local_4e0._0_16_ = auVar132;
  auVar132 = vshufps_avx(ZEXT416(uVar85),ZEXT416(uVar85),0);
  local_500._16_16_ = auVar132;
  local_500._0_16_ = auVar132;
  register0x00001390 = auVar96;
  _local_a00 = auVar96;
  auVar274 = ZEXT3264(_local_a00);
  uVar88 = 1;
  uVar83 = 0;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_3a0,auVar106);
  auVar132 = vsqrtss_avx(local_9c0,local_9c0);
  auVar9 = vsqrtss_avx(local_9c0,local_9c0);
  auVar301 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = &DAT_3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar222._16_4_ = 0x3f800000;
  auVar222._20_4_ = 0x3f800000;
  auVar222._24_4_ = 0x3f800000;
  auVar222._28_4_ = 0x3f800000;
  do {
    auVar294 = auVar301._0_16_;
    auVar137 = vmovshdup_avx(auVar294);
    fVar187 = auVar137._0_4_ - auVar301._0_4_;
    auVar137 = vshufps_avx(auVar294,auVar294,0);
    local_9e0._16_16_ = auVar137;
    local_9e0._0_16_ = auVar137;
    auVar12 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
    local_960._16_16_ = auVar12;
    local_960._0_16_ = auVar12;
    fVar129 = auVar12._0_4_;
    fVar164 = auVar12._4_4_;
    fVar165 = auVar12._8_4_;
    fVar167 = auVar12._12_4_;
    fVar90 = auVar137._0_4_;
    auVar146._0_4_ = fVar90 + fVar129 * 0.0;
    fVar119 = auVar137._4_4_;
    auVar146._4_4_ = fVar119 + fVar164 * 0.14285715;
    fVar121 = auVar137._8_4_;
    auVar146._8_4_ = fVar121 + fVar165 * 0.2857143;
    fVar123 = auVar137._12_4_;
    auVar146._12_4_ = fVar123 + fVar167 * 0.42857146;
    auVar146._16_4_ = fVar90 + fVar129 * 0.5714286;
    auVar146._20_4_ = fVar119 + fVar164 * 0.71428573;
    auVar146._24_4_ = fVar121 + fVar165 * 0.8571429;
    auVar146._28_4_ = fVar123 + fVar167;
    auVar105 = vsubps_avx(auVar222,auVar146);
    fVar253 = auVar105._0_4_;
    fVar202 = auVar105._4_4_;
    fVar255 = auVar105._8_4_;
    fVar203 = auVar105._12_4_;
    fVar257 = auVar105._16_4_;
    fVar204 = auVar105._20_4_;
    fVar262 = auVar105._24_4_;
    fVar209 = auVar201._28_4_;
    fVar263 = (float)local_2a0._0_4_ * auVar146._0_4_ + (float)local_220._0_4_ * fVar253;
    fVar276 = (float)local_2a0._4_4_ * auVar146._4_4_ + (float)local_220._4_4_ * fVar202;
    fVar279 = fStack_298 * auVar146._8_4_ + fStack_218 * fVar255;
    fVar282 = fStack_294 * auVar146._12_4_ + fStack_214 * fVar203;
    fVar284 = fStack_290 * auVar146._16_4_ + fStack_210 * fVar257;
    fVar286 = fStack_28c * auVar146._20_4_ + fStack_20c * fVar204;
    fVar288 = fStack_288 * auVar146._24_4_ + fStack_208 * fVar262;
    fVar275 = (float)local_2c0._0_4_ * auVar146._0_4_ + (float)local_240._0_4_ * fVar253;
    fVar278 = (float)local_2c0._4_4_ * auVar146._4_4_ + (float)local_240._4_4_ * fVar202;
    fVar281 = fStack_2b8 * auVar146._8_4_ + fStack_238 * fVar255;
    fVar205 = fStack_2b4 * auVar146._12_4_ + fStack_234 * fVar203;
    fVar206 = fStack_2b0 * auVar146._16_4_ + fStack_230 * fVar257;
    fVar207 = fStack_2ac * auVar146._20_4_ + fStack_22c * fVar204;
    fVar208 = fStack_2a8 * auVar146._24_4_ + fStack_228 * fVar262;
    fVar210 = (float)local_2e0._0_4_ * auVar146._0_4_ + (float)local_260._0_4_ * fVar253;
    fVar226 = (float)local_2e0._4_4_ * auVar146._4_4_ + (float)local_260._4_4_ * fVar202;
    fVar227 = fStack_2d8 * auVar146._8_4_ + fStack_258 * fVar255;
    fVar228 = fStack_2d4 * auVar146._12_4_ + fStack_254 * fVar203;
    fVar229 = fStack_2d0 * auVar146._16_4_ + fStack_250 * fVar257;
    fVar231 = fStack_2cc * auVar146._20_4_ + fStack_24c * fVar204;
    fVar233 = fStack_2c8 * auVar146._24_4_ + fStack_248 * fVar262;
    fVar236 = (float)local_300._0_4_ * auVar146._0_4_ + (float)local_280._0_4_ * fVar253;
    fVar254 = (float)local_300._4_4_ * auVar146._4_4_ + (float)local_280._4_4_ * fVar202;
    fVar256 = fStack_2f8 * auVar146._8_4_ + fStack_278 * fVar255;
    fVar258 = fStack_2f4 * auVar146._12_4_ + fStack_274 * fVar203;
    fVar259 = fStack_2f0 * auVar146._16_4_ + fStack_270 * fVar257;
    fVar260 = fStack_2ec * auVar146._20_4_ + fStack_26c * fVar204;
    fVar261 = fStack_2e8 * auVar146._24_4_ + fStack_268 * fVar262;
    fVar360 = auVar359._28_4_;
    fVar372 = fStack_204 + fVar360;
    auVar341._0_4_ =
         ((float)local_220._0_4_ * auVar146._0_4_ + fVar253 * (float)local_1a0._0_4_) * fVar253 +
         auVar146._0_4_ * fVar263;
    auVar341._4_4_ =
         ((float)local_220._4_4_ * auVar146._4_4_ + fVar202 * (float)local_1a0._4_4_) * fVar202 +
         auVar146._4_4_ * fVar276;
    auVar341._8_4_ =
         (fStack_218 * auVar146._8_4_ + fVar255 * fStack_198) * fVar255 + auVar146._8_4_ * fVar279;
    auVar341._12_4_ =
         (fStack_214 * auVar146._12_4_ + fVar203 * fStack_194) * fVar203 + auVar146._12_4_ * fVar282
    ;
    auVar341._16_4_ =
         (fStack_210 * auVar146._16_4_ + fVar257 * fStack_190) * fVar257 + auVar146._16_4_ * fVar284
    ;
    auVar341._20_4_ =
         (fStack_20c * auVar146._20_4_ + fVar204 * fStack_18c) * fVar204 + auVar146._20_4_ * fVar286
    ;
    auVar341._24_4_ =
         (fStack_208 * auVar146._24_4_ + fVar262 * fStack_188) * fVar262 + auVar146._24_4_ * fVar288
    ;
    auVar341._28_4_ = fStack_2e4 + fVar360;
    auVar354._0_4_ =
         fVar253 * ((float)local_240._0_4_ * auVar146._0_4_ + fVar253 * (float)local_1c0._0_4_) +
         auVar146._0_4_ * fVar275;
    auVar354._4_4_ =
         fVar202 * ((float)local_240._4_4_ * auVar146._4_4_ + fVar202 * (float)local_1c0._4_4_) +
         auVar146._4_4_ * fVar278;
    auVar354._8_4_ =
         fVar255 * (fStack_238 * auVar146._8_4_ + fVar255 * fStack_1b8) + auVar146._8_4_ * fVar281;
    auVar354._12_4_ =
         fVar203 * (fStack_234 * auVar146._12_4_ + fVar203 * fStack_1b4) + auVar146._12_4_ * fVar205
    ;
    auVar354._16_4_ =
         fVar257 * (fStack_230 * auVar146._16_4_ + fVar257 * fStack_1b0) + auVar146._16_4_ * fVar206
    ;
    auVar354._20_4_ =
         fVar204 * (fStack_22c * auVar146._20_4_ + fVar204 * fStack_1ac) + auVar146._20_4_ * fVar207
    ;
    auVar354._24_4_ =
         fVar262 * (fStack_228 * auVar146._24_4_ + fVar262 * fStack_1a8) + auVar146._24_4_ * fVar208
    ;
    auVar354._28_4_ = fVar209 + auVar301._28_4_ + fVar360;
    auVar357._0_4_ =
         fVar253 * ((float)local_260._0_4_ * auVar146._0_4_ + fVar253 * (float)local_1e0._0_4_) +
         auVar146._0_4_ * fVar210;
    auVar357._4_4_ =
         fVar202 * ((float)local_260._4_4_ * auVar146._4_4_ + fVar202 * (float)local_1e0._4_4_) +
         auVar146._4_4_ * fVar226;
    auVar357._8_4_ =
         fVar255 * (fStack_258 * auVar146._8_4_ + fVar255 * fStack_1d8) + auVar146._8_4_ * fVar227;
    auVar357._12_4_ =
         fVar203 * (fStack_254 * auVar146._12_4_ + fVar203 * fStack_1d4) + auVar146._12_4_ * fVar228
    ;
    auVar357._16_4_ =
         fVar257 * (fStack_250 * auVar146._16_4_ + fVar257 * fStack_1d0) + auVar146._16_4_ * fVar229
    ;
    auVar357._20_4_ =
         fVar204 * (fStack_24c * auVar146._20_4_ + fVar204 * fStack_1cc) + auVar146._20_4_ * fVar231
    ;
    auVar357._24_4_ =
         fVar262 * (fStack_248 * auVar146._24_4_ + fVar262 * fStack_1c8) + auVar146._24_4_ * fVar233
    ;
    auVar357._28_4_ = fStack_2c4 + fVar360;
    auVar295._0_4_ =
         auVar146._0_4_ * fVar236 +
         fVar253 * ((float)local_280._0_4_ * auVar146._0_4_ + fVar253 * (float)local_200._0_4_);
    auVar295._4_4_ =
         auVar146._4_4_ * fVar254 +
         fVar202 * ((float)local_280._4_4_ * auVar146._4_4_ + fVar202 * (float)local_200._4_4_);
    auVar295._8_4_ =
         auVar146._8_4_ * fVar256 + fVar255 * (fStack_278 * auVar146._8_4_ + fVar255 * fStack_1f8);
    auVar295._12_4_ =
         auVar146._12_4_ * fVar258 + fVar203 * (fStack_274 * auVar146._12_4_ + fVar203 * fStack_1f4)
    ;
    auVar295._16_4_ =
         auVar146._16_4_ * fVar259 + fVar257 * (fStack_270 * auVar146._16_4_ + fVar257 * fStack_1f0)
    ;
    auVar295._20_4_ =
         auVar146._20_4_ * fVar260 + fVar204 * (fStack_26c * auVar146._20_4_ + fVar204 * fStack_1ec)
    ;
    auVar295._24_4_ =
         auVar146._24_4_ * fVar261 + fVar262 * (fStack_268 * auVar146._24_4_ + fVar262 * fStack_1e8)
    ;
    auVar295._28_4_ = fStack_2c4 + fStack_2a4;
    auVar387._0_4_ =
         (auVar146._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar253) *
         auVar146._0_4_ + fVar253 * fVar263;
    auVar387._4_4_ =
         (auVar146._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar202) *
         auVar146._4_4_ + fVar202 * fVar276;
    auVar387._8_4_ =
         (auVar146._8_4_ * fStack_318 + fStack_298 * fVar255) * auVar146._8_4_ + fVar255 * fVar279;
    auVar387._12_4_ =
         (auVar146._12_4_ * fStack_314 + fStack_294 * fVar203) * auVar146._12_4_ + fVar203 * fVar282
    ;
    auVar387._16_4_ =
         (auVar146._16_4_ * fStack_310 + fStack_290 * fVar257) * auVar146._16_4_ + fVar257 * fVar284
    ;
    auVar387._20_4_ =
         (auVar146._20_4_ * fStack_30c + fStack_28c * fVar204) * auVar146._20_4_ + fVar204 * fVar286
    ;
    auVar387._24_4_ =
         (auVar146._24_4_ * fStack_308 + fStack_288 * fVar262) * auVar146._24_4_ + fVar262 * fVar288
    ;
    auVar387._28_4_ = fStack_2c4 + fVar209 + auVar274._28_4_;
    auVar197._0_4_ =
         (auVar146._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar253) *
         auVar146._0_4_ + fVar253 * fVar275;
    auVar197._4_4_ =
         (auVar146._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar202) *
         auVar146._4_4_ + fVar202 * fVar278;
    auVar197._8_4_ =
         (auVar146._8_4_ * fStack_338 + fStack_2b8 * fVar255) * auVar146._8_4_ + fVar255 * fVar281;
    auVar197._12_4_ =
         (auVar146._12_4_ * fStack_334 + fStack_2b4 * fVar203) * auVar146._12_4_ + fVar203 * fVar205
    ;
    auVar197._16_4_ =
         (auVar146._16_4_ * fStack_330 + fStack_2b0 * fVar257) * auVar146._16_4_ + fVar257 * fVar206
    ;
    auVar197._20_4_ =
         (auVar146._20_4_ * fStack_32c + fStack_2ac * fVar204) * auVar146._20_4_ + fVar204 * fVar207
    ;
    auVar197._24_4_ =
         (auVar146._24_4_ * fStack_328 + fStack_2a8 * fVar262) * auVar146._24_4_ + fVar262 * fVar208
    ;
    auVar197._28_4_ = fStack_2c4 + auVar222._28_4_ + fVar209;
    auVar223._0_4_ =
         auVar146._0_4_ *
         (auVar146._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar253) +
         fVar253 * fVar210;
    auVar223._4_4_ =
         auVar146._4_4_ *
         (auVar146._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar202) +
         fVar202 * fVar226;
    auVar223._8_4_ =
         auVar146._8_4_ * (auVar146._8_4_ * fStack_358 + fStack_2d8 * fVar255) + fVar255 * fVar227;
    auVar223._12_4_ =
         auVar146._12_4_ * (auVar146._12_4_ * fStack_354 + fStack_2d4 * fVar203) + fVar203 * fVar228
    ;
    auVar223._16_4_ =
         auVar146._16_4_ * (auVar146._16_4_ * fStack_350 + fStack_2d0 * fVar257) + fVar257 * fVar229
    ;
    auVar223._20_4_ =
         auVar146._20_4_ * (auVar146._20_4_ * fStack_34c + fStack_2cc * fVar204) + fVar204 * fVar231
    ;
    auVar223._24_4_ =
         auVar146._24_4_ * (auVar146._24_4_ * fStack_348 + fStack_2c8 * fVar262) + fVar262 * fVar233
    ;
    auVar223._28_4_ = fVar372 + auVar222._28_4_ + 1.0;
    auVar245._0_4_ =
         (auVar146._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar253) *
         auVar146._0_4_ + fVar253 * fVar236;
    auVar245._4_4_ =
         (auVar146._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar202) *
         auVar146._4_4_ + fVar202 * fVar254;
    auVar245._8_4_ =
         (auVar146._8_4_ * fStack_378 + fStack_2f8 * fVar255) * auVar146._8_4_ + fVar255 * fVar256;
    auVar245._12_4_ =
         (auVar146._12_4_ * fStack_374 + fStack_2f4 * fVar203) * auVar146._12_4_ + fVar203 * fVar258
    ;
    auVar245._16_4_ =
         (auVar146._16_4_ * fStack_370 + fStack_2f0 * fVar257) * auVar146._16_4_ + fVar257 * fVar259
    ;
    auVar245._20_4_ =
         (auVar146._20_4_ * fStack_36c + fStack_2ec * fVar204) * auVar146._20_4_ + fVar204 * fVar260
    ;
    auVar245._24_4_ =
         (auVar146._24_4_ * fStack_368 + fStack_2e8 * fVar262) * auVar146._24_4_ + fVar262 * fVar261
    ;
    auVar245._28_4_ = fVar360 + fStack_224 + fVar360 + 1.0;
    fVar91 = auVar341._0_4_ * fVar253 + auVar387._0_4_ * auVar146._0_4_;
    fVar120 = auVar341._4_4_ * fVar202 + auVar387._4_4_ * auVar146._4_4_;
    fVar122 = auVar341._8_4_ * fVar255 + auVar387._8_4_ * auVar146._8_4_;
    fVar124 = auVar341._12_4_ * fVar203 + auVar387._12_4_ * auVar146._12_4_;
    fVar125 = auVar341._16_4_ * fVar257 + auVar387._16_4_ * auVar146._16_4_;
    fVar126 = auVar341._20_4_ * fVar204 + auVar387._20_4_ * auVar146._20_4_;
    fVar127 = auVar341._24_4_ * fVar262 + auVar387._24_4_ * auVar146._24_4_;
    fVar128 = fVar360 + fStack_224 + fStack_2c4;
    auVar375._0_4_ = auVar354._0_4_ * fVar253 + auVar146._0_4_ * auVar197._0_4_;
    auVar375._4_4_ = auVar354._4_4_ * fVar202 + auVar146._4_4_ * auVar197._4_4_;
    auVar375._8_4_ = auVar354._8_4_ * fVar255 + auVar146._8_4_ * auVar197._8_4_;
    auVar375._12_4_ = auVar354._12_4_ * fVar203 + auVar146._12_4_ * auVar197._12_4_;
    auVar375._16_4_ = auVar354._16_4_ * fVar257 + auVar146._16_4_ * auVar197._16_4_;
    auVar375._20_4_ = auVar354._20_4_ * fVar204 + auVar146._20_4_ * auVar197._20_4_;
    auVar375._24_4_ = auVar354._24_4_ * fVar262 + auVar146._24_4_ * auVar197._24_4_;
    auVar375._28_4_ = fStack_2c4 + fVar372;
    auVar398._0_4_ = auVar357._0_4_ * fVar253 + auVar146._0_4_ * auVar223._0_4_;
    auVar398._4_4_ = auVar357._4_4_ * fVar202 + auVar146._4_4_ * auVar223._4_4_;
    auVar398._8_4_ = auVar357._8_4_ * fVar255 + auVar146._8_4_ * auVar223._8_4_;
    auVar398._12_4_ = auVar357._12_4_ * fVar203 + auVar146._12_4_ * auVar223._12_4_;
    auVar398._16_4_ = auVar357._16_4_ * fVar257 + auVar146._16_4_ * auVar223._16_4_;
    auVar398._20_4_ = auVar357._20_4_ * fVar204 + auVar146._20_4_ * auVar223._20_4_;
    auVar398._24_4_ = auVar357._24_4_ * fVar262 + auVar146._24_4_ * auVar223._24_4_;
    auVar398._28_4_ = fVar372 + fStack_2c4;
    local_7c0._0_4_ = fVar253 * auVar295._0_4_ + auVar146._0_4_ * auVar245._0_4_;
    local_7c0._4_4_ = fVar202 * auVar295._4_4_ + auVar146._4_4_ * auVar245._4_4_;
    local_7c0._8_4_ = fVar255 * auVar295._8_4_ + auVar146._8_4_ * auVar245._8_4_;
    local_7c0._12_4_ = fVar203 * auVar295._12_4_ + auVar146._12_4_ * auVar245._12_4_;
    local_7c0._16_4_ = fVar257 * auVar295._16_4_ + auVar146._16_4_ * auVar245._16_4_;
    local_7c0._20_4_ = fVar204 * auVar295._20_4_ + auVar146._20_4_ * auVar245._20_4_;
    local_7c0._24_4_ = fVar262 * auVar295._24_4_ + auVar146._24_4_ * auVar245._24_4_;
    local_7c0._28_4_ = auVar105._28_4_ + auVar146._28_4_;
    auVar222 = vsubps_avx(auVar387,auVar341);
    auVar105 = vsubps_avx(auVar197,auVar354);
    auVar106 = vsubps_avx(auVar223,auVar357);
    auVar146 = vsubps_avx(auVar245,auVar295);
    auVar137 = vshufps_avx(ZEXT416((uint)(fVar187 * 0.04761905)),
                           ZEXT416((uint)(fVar187 * 0.04761905)),0);
    fVar226 = auVar137._0_4_;
    fVar290 = fVar226 * auVar222._0_4_ * 3.0;
    fVar227 = auVar137._4_4_;
    fVar302 = fVar227 * auVar222._4_4_ * 3.0;
    auVar20._4_4_ = fVar302;
    auVar20._0_4_ = fVar290;
    fVar236 = auVar137._8_4_;
    fVar303 = fVar236 * auVar222._8_4_ * 3.0;
    auVar20._8_4_ = fVar303;
    fVar206 = auVar137._12_4_;
    fVar305 = fVar206 * auVar222._12_4_ * 3.0;
    auVar20._12_4_ = fVar305;
    fVar307 = fVar226 * auVar222._16_4_ * 3.0;
    auVar20._16_4_ = fVar307;
    fVar309 = fVar227 * auVar222._20_4_ * 3.0;
    auVar20._20_4_ = fVar309;
    fVar311 = fVar236 * auVar222._24_4_ * 3.0;
    auVar20._24_4_ = fVar311;
    auVar20._28_4_ = auVar295._28_4_;
    fVar313 = fVar226 * auVar105._0_4_ * 3.0;
    fVar319 = fVar227 * auVar105._4_4_ * 3.0;
    local_980._4_4_ = fVar319;
    local_980._0_4_ = fVar313;
    fVar322 = fVar236 * auVar105._8_4_ * 3.0;
    local_980._8_4_ = fVar322;
    fVar325 = fVar206 * auVar105._12_4_ * 3.0;
    local_980._12_4_ = fVar325;
    fVar328 = fVar226 * auVar105._16_4_ * 3.0;
    local_980._16_4_ = fVar328;
    fVar331 = fVar227 * auVar105._20_4_ * 3.0;
    local_980._20_4_ = fVar331;
    fVar334 = fVar236 * auVar105._24_4_ * 3.0;
    local_980._24_4_ = fVar334;
    local_980._28_4_ = fStack_2c4;
    fVar361 = fVar226 * auVar106._0_4_ * 3.0;
    fVar366 = fVar227 * auVar106._4_4_ * 3.0;
    auVar19._4_4_ = fVar366;
    auVar19._0_4_ = fVar361;
    fVar367 = fVar236 * auVar106._8_4_ * 3.0;
    auVar19._8_4_ = fVar367;
    fVar368 = fVar206 * auVar106._12_4_ * 3.0;
    auVar19._12_4_ = fVar368;
    fVar369 = fVar226 * auVar106._16_4_ * 3.0;
    auVar19._16_4_ = fVar369;
    fVar370 = fVar227 * auVar106._20_4_ * 3.0;
    auVar19._20_4_ = fVar370;
    fVar371 = fVar236 * auVar106._24_4_ * 3.0;
    auVar19._24_4_ = fVar371;
    auVar19._28_4_ = fVar372;
    fVar257 = fVar226 * auVar146._0_4_ * 3.0;
    fVar204 = fVar227 * auVar146._4_4_ * 3.0;
    auVar14._4_4_ = fVar204;
    auVar14._0_4_ = fVar257;
    fVar205 = fVar236 * auVar146._8_4_ * 3.0;
    auVar14._8_4_ = fVar205;
    fVar206 = fVar206 * auVar146._12_4_ * 3.0;
    auVar14._12_4_ = fVar206;
    fVar226 = fVar226 * auVar146._16_4_ * 3.0;
    auVar14._16_4_ = fVar226;
    fVar227 = fVar227 * auVar146._20_4_ * 3.0;
    auVar14._20_4_ = fVar227;
    fVar236 = fVar236 * auVar146._24_4_ * 3.0;
    auVar14._24_4_ = fVar236;
    auVar14._28_4_ = auVar222._28_4_;
    auVar105 = vperm2f128_avx(auVar375,auVar375,1);
    auVar105 = vshufps_avx(auVar105,auVar375,0x30);
    local_aa0 = vshufps_avx(auVar375,auVar105,0x29);
    auVar105 = vperm2f128_avx(auVar398,auVar398,1);
    auVar105 = vshufps_avx(auVar105,auVar398,0x30);
    auVar146 = vshufps_avx(auVar398,auVar105,0x29);
    auVar106 = vsubps_avx(local_7c0,auVar14);
    auVar105 = vperm2f128_avx(auVar106,auVar106,1);
    auVar105 = vshufps_avx(auVar105,auVar106,0x30);
    local_7e0 = vshufps_avx(auVar106,auVar105,0x29);
    auVar14 = vsubps_avx(local_aa0,auVar375);
    auVar15 = vsubps_avx(auVar146,auVar398);
    fVar253 = auVar14._0_4_;
    fVar262 = auVar14._4_4_;
    auVar16._4_4_ = fVar366 * fVar262;
    auVar16._0_4_ = fVar361 * fVar253;
    fVar207 = auVar14._8_4_;
    auVar16._8_4_ = fVar367 * fVar207;
    fVar228 = auVar14._12_4_;
    auVar16._12_4_ = fVar368 * fVar228;
    fVar256 = auVar14._16_4_;
    auVar16._16_4_ = fVar369 * fVar256;
    fVar276 = auVar14._20_4_;
    auVar16._20_4_ = fVar370 * fVar276;
    fVar360 = auVar14._24_4_;
    auVar16._24_4_ = fVar371 * fVar360;
    auVar16._28_4_ = auVar106._28_4_;
    fVar202 = auVar15._0_4_;
    fVar275 = auVar15._4_4_;
    auVar17._4_4_ = fVar319 * fVar275;
    auVar17._0_4_ = fVar313 * fVar202;
    fVar208 = auVar15._8_4_;
    auVar17._8_4_ = fVar322 * fVar208;
    fVar229 = auVar15._12_4_;
    auVar17._12_4_ = fVar325 * fVar229;
    fVar258 = auVar15._16_4_;
    auVar17._16_4_ = fVar328 * fVar258;
    fVar279 = auVar15._20_4_;
    auVar17._20_4_ = fVar331 * fVar279;
    fVar10 = auVar15._24_4_;
    auVar17._24_4_ = fVar334 * fVar10;
    auVar17._28_4_ = auVar105._28_4_;
    auVar15 = vsubps_avx(auVar17,auVar16);
    auVar70._4_4_ = fVar120;
    auVar70._0_4_ = fVar91;
    auVar70._8_4_ = fVar122;
    auVar70._12_4_ = fVar124;
    auVar70._16_4_ = fVar125;
    auVar70._20_4_ = fVar126;
    auVar70._24_4_ = fVar127;
    auVar70._28_4_ = fVar128;
    auVar105 = vperm2f128_avx(auVar70,auVar70,1);
    auVar105 = vshufps_avx(auVar105,auVar70,0x30);
    auVar14 = vshufps_avx(auVar70,auVar105,0x29);
    auVar16 = vsubps_avx(auVar14,auVar70);
    auVar379._4_4_ = fVar275 * fVar302;
    auVar379._0_4_ = fVar202 * fVar290;
    auVar379._8_4_ = fVar208 * fVar303;
    auVar379._12_4_ = fVar229 * fVar305;
    auVar379._16_4_ = fVar258 * fVar307;
    auVar379._20_4_ = fVar279 * fVar309;
    auVar379._24_4_ = fVar10 * fVar311;
    auVar379._28_4_ = auVar14._28_4_;
    fVar255 = auVar16._0_4_;
    fVar278 = auVar16._4_4_;
    auVar18._4_4_ = fVar366 * fVar278;
    auVar18._0_4_ = fVar361 * fVar255;
    fVar209 = auVar16._8_4_;
    auVar18._8_4_ = fVar367 * fVar209;
    fVar231 = auVar16._12_4_;
    auVar18._12_4_ = fVar368 * fVar231;
    fVar259 = auVar16._16_4_;
    auVar18._16_4_ = fVar369 * fVar259;
    fVar282 = auVar16._20_4_;
    auVar18._20_4_ = fVar370 * fVar282;
    fVar11 = auVar16._24_4_;
    auVar18._24_4_ = fVar371 * fVar11;
    auVar18._28_4_ = fVar128;
    auVar17 = vsubps_avx(auVar18,auVar379);
    auVar21._4_4_ = fVar319 * fVar278;
    auVar21._0_4_ = fVar313 * fVar255;
    auVar21._8_4_ = fVar322 * fVar209;
    auVar21._12_4_ = fVar325 * fVar231;
    auVar21._16_4_ = fVar328 * fVar259;
    auVar21._20_4_ = fVar331 * fVar282;
    auVar21._24_4_ = fVar334 * fVar11;
    auVar21._28_4_ = fVar128;
    auVar318._4_4_ = fVar302 * fVar262;
    auVar318._0_4_ = fVar290 * fVar253;
    auVar318._8_4_ = fVar303 * fVar207;
    auVar318._12_4_ = fVar305 * fVar228;
    auVar318._16_4_ = fVar307 * fVar256;
    auVar318._20_4_ = fVar309 * fVar276;
    auVar318._24_4_ = fVar311 * fVar360;
    auVar318._28_4_ = auVar354._28_4_;
    auVar379 = vsubps_avx(auVar318,auVar21);
    fVar187 = auVar379._28_4_;
    fVar254 = auVar17._28_4_ + fVar187;
    auVar198._0_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar202 * fVar202;
    auVar198._4_4_ = fVar278 * fVar278 + fVar262 * fVar262 + fVar275 * fVar275;
    auVar198._8_4_ = fVar209 * fVar209 + fVar207 * fVar207 + fVar208 * fVar208;
    auVar198._12_4_ = fVar231 * fVar231 + fVar228 * fVar228 + fVar229 * fVar229;
    auVar198._16_4_ = fVar259 * fVar259 + fVar256 * fVar256 + fVar258 * fVar258;
    auVar198._20_4_ = fVar282 * fVar282 + fVar276 * fVar276 + fVar279 * fVar279;
    auVar198._24_4_ = fVar11 * fVar11 + fVar360 * fVar360 + fVar10 * fVar10;
    auVar198._28_4_ = fVar187 + fVar187 + fVar254;
    auVar105 = vrcpps_avx(auVar198);
    fVar261 = auVar105._0_4_;
    fVar263 = auVar105._4_4_;
    auVar22._4_4_ = fVar263 * auVar198._4_4_;
    auVar22._0_4_ = fVar261 * auVar198._0_4_;
    fVar286 = auVar105._8_4_;
    auVar22._8_4_ = fVar286 * auVar198._8_4_;
    fVar288 = auVar105._12_4_;
    auVar22._12_4_ = fVar288 * auVar198._12_4_;
    fVar230 = auVar105._16_4_;
    auVar22._16_4_ = fVar230 * auVar198._16_4_;
    fVar232 = auVar105._20_4_;
    auVar22._20_4_ = fVar232 * auVar198._20_4_;
    fVar234 = auVar105._24_4_;
    auVar22._24_4_ = fVar234 * auVar198._24_4_;
    auVar22._28_4_ = auVar354._28_4_;
    auVar376._8_4_ = 0x3f800000;
    auVar376._0_8_ = &DAT_3f8000003f800000;
    auVar376._12_4_ = 0x3f800000;
    auVar376._16_4_ = 0x3f800000;
    auVar376._20_4_ = 0x3f800000;
    auVar376._24_4_ = 0x3f800000;
    auVar376._28_4_ = 0x3f800000;
    auVar18 = vsubps_avx(auVar376,auVar22);
    fVar261 = auVar18._0_4_ * fVar261 + fVar261;
    fVar263 = auVar18._4_4_ * fVar263 + fVar263;
    fVar286 = auVar18._8_4_ * fVar286 + fVar286;
    fVar288 = auVar18._12_4_ * fVar288 + fVar288;
    fVar230 = auVar18._16_4_ * fVar230 + fVar230;
    fVar232 = auVar18._20_4_ * fVar232 + fVar232;
    fVar234 = auVar18._24_4_ * fVar234 + fVar234;
    auVar106 = vperm2f128_avx(local_980,local_980,1);
    auVar106 = vshufps_avx(auVar106,local_980,0x30);
    local_a80 = vshufps_avx(local_980,auVar106,0x29);
    auVar106 = vperm2f128_avx(auVar19,auVar19,1);
    auVar106 = vshufps_avx(auVar106,auVar19,0x30);
    local_a20 = vshufps_avx(auVar19,auVar106,0x29);
    fVar373 = local_a20._0_4_;
    fVar380 = local_a20._4_4_;
    auVar23._4_4_ = fVar380 * fVar262;
    auVar23._0_4_ = fVar373 * fVar253;
    fVar381 = local_a20._8_4_;
    auVar23._8_4_ = fVar381 * fVar207;
    fVar382 = local_a20._12_4_;
    auVar23._12_4_ = fVar382 * fVar228;
    fVar383 = local_a20._16_4_;
    auVar23._16_4_ = fVar383 * fVar256;
    fVar384 = local_a20._20_4_;
    auVar23._20_4_ = fVar384 * fVar276;
    fVar385 = local_a20._24_4_;
    auVar23._24_4_ = fVar385 * fVar360;
    auVar23._28_4_ = auVar106._28_4_;
    fVar314 = local_a80._0_4_;
    fVar320 = local_a80._4_4_;
    auVar24._4_4_ = fVar320 * fVar275;
    auVar24._0_4_ = fVar314 * fVar202;
    fVar323 = local_a80._8_4_;
    auVar24._8_4_ = fVar323 * fVar208;
    fVar326 = local_a80._12_4_;
    auVar24._12_4_ = fVar326 * fVar229;
    fVar329 = local_a80._16_4_;
    auVar24._16_4_ = fVar329 * fVar258;
    fVar332 = local_a80._20_4_;
    auVar24._20_4_ = fVar332 * fVar279;
    fVar335 = local_a80._24_4_;
    auVar24._24_4_ = fVar335 * fVar10;
    auVar24._28_4_ = fVar372;
    auVar19 = vsubps_avx(auVar24,auVar23);
    auVar106 = vperm2f128_avx(auVar20,auVar20,1);
    auVar106 = vshufps_avx(auVar106,auVar20,0x30);
    local_940 = vshufps_avx(auVar20,auVar106,0x29);
    fVar203 = local_940._0_4_;
    fVar281 = local_940._4_4_;
    auVar25._4_4_ = fVar275 * fVar281;
    auVar25._0_4_ = fVar202 * fVar203;
    fVar210 = local_940._8_4_;
    auVar25._8_4_ = fVar208 * fVar210;
    fVar233 = local_940._12_4_;
    auVar25._12_4_ = fVar229 * fVar233;
    fVar260 = local_940._16_4_;
    auVar25._16_4_ = fVar258 * fVar260;
    fVar284 = local_940._20_4_;
    auVar25._20_4_ = fVar279 * fVar284;
    fVar372 = local_940._24_4_;
    auVar25._24_4_ = fVar10 * fVar372;
    auVar25._28_4_ = auVar106._28_4_;
    auVar26._4_4_ = fVar380 * fVar278;
    auVar26._0_4_ = fVar373 * fVar255;
    auVar26._8_4_ = fVar381 * fVar209;
    auVar26._12_4_ = fVar382 * fVar231;
    auVar26._16_4_ = fVar383 * fVar259;
    auVar26._20_4_ = fVar384 * fVar282;
    uVar7 = local_a20._28_4_;
    auVar26._24_4_ = fVar385 * fVar11;
    auVar26._28_4_ = uVar7;
    auVar20 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar320 * fVar278;
    auVar27._0_4_ = fVar314 * fVar255;
    auVar27._8_4_ = fVar323 * fVar209;
    auVar27._12_4_ = fVar326 * fVar231;
    auVar27._16_4_ = fVar329 * fVar259;
    auVar27._20_4_ = fVar332 * fVar282;
    auVar27._24_4_ = fVar335 * fVar11;
    auVar27._28_4_ = uVar7;
    auVar28._4_4_ = fVar281 * fVar262;
    auVar28._0_4_ = fVar203 * fVar253;
    auVar28._8_4_ = fVar210 * fVar207;
    auVar28._12_4_ = fVar233 * fVar228;
    auVar28._16_4_ = fVar260 * fVar256;
    auVar28._20_4_ = fVar284 * fVar276;
    auVar28._24_4_ = fVar372 * fVar360;
    auVar28._28_4_ = auVar387._28_4_;
    auVar106 = vsubps_avx(auVar28,auVar27);
    fVar187 = auVar106._28_4_;
    auVar29._4_4_ =
         (auVar15._4_4_ * auVar15._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar379._4_4_ * auVar379._4_4_) * fVar263;
    auVar29._0_4_ =
         (auVar15._0_4_ * auVar15._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar379._0_4_ * auVar379._0_4_) * fVar261;
    auVar29._8_4_ =
         (auVar15._8_4_ * auVar15._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar379._8_4_ * auVar379._8_4_) * fVar286;
    auVar29._12_4_ =
         (auVar15._12_4_ * auVar15._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar379._12_4_ * auVar379._12_4_) * fVar288;
    auVar29._16_4_ =
         (auVar15._16_4_ * auVar15._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar379._16_4_ * auVar379._16_4_) * fVar230;
    auVar29._20_4_ =
         (auVar15._20_4_ * auVar15._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar379._20_4_ * auVar379._20_4_) * fVar232;
    auVar29._24_4_ =
         (auVar15._24_4_ * auVar15._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar379._24_4_ * auVar379._24_4_) * fVar234;
    auVar29._28_4_ = auVar15._28_4_ + fVar254;
    auVar15._4_4_ =
         (auVar19._4_4_ * auVar19._4_4_ +
         auVar20._4_4_ * auVar20._4_4_ + auVar106._4_4_ * auVar106._4_4_) * fVar263;
    auVar15._0_4_ =
         (auVar19._0_4_ * auVar19._0_4_ +
         auVar20._0_4_ * auVar20._0_4_ + auVar106._0_4_ * auVar106._0_4_) * fVar261;
    auVar15._8_4_ =
         (auVar19._8_4_ * auVar19._8_4_ +
         auVar20._8_4_ * auVar20._8_4_ + auVar106._8_4_ * auVar106._8_4_) * fVar286;
    auVar15._12_4_ =
         (auVar19._12_4_ * auVar19._12_4_ +
         auVar20._12_4_ * auVar20._12_4_ + auVar106._12_4_ * auVar106._12_4_) * fVar288;
    auVar15._16_4_ =
         (auVar19._16_4_ * auVar19._16_4_ +
         auVar20._16_4_ * auVar20._16_4_ + auVar106._16_4_ * auVar106._16_4_) * fVar230;
    auVar15._20_4_ =
         (auVar19._20_4_ * auVar19._20_4_ +
         auVar20._20_4_ * auVar20._20_4_ + auVar106._20_4_ * auVar106._20_4_) * fVar232;
    auVar15._24_4_ =
         (auVar19._24_4_ * auVar19._24_4_ +
         auVar20._24_4_ * auVar20._24_4_ + auVar106._24_4_ * auVar106._24_4_) * fVar234;
    auVar15._28_4_ = auVar18._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar29,auVar15);
    auVar106 = vperm2f128_avx(local_7c0,local_7c0,1);
    auVar106 = vshufps_avx(auVar106,local_7c0,0x30);
    local_800 = vshufps_avx(local_7c0,auVar106,0x29);
    local_820._0_4_ = (float)local_7c0._0_4_ + fVar257;
    local_820._4_4_ = local_7c0._4_4_ + fVar204;
    local_820._8_4_ = local_7c0._8_4_ + fVar205;
    local_820._12_4_ = local_7c0._12_4_ + fVar206;
    local_820._16_4_ = local_7c0._16_4_ + fVar226;
    local_820._20_4_ = local_7c0._20_4_ + fVar227;
    local_820._24_4_ = local_7c0._24_4_ + fVar236;
    local_820._28_4_ = local_7c0._28_4_ + auVar222._28_4_;
    auVar106 = vmaxps_avx(local_7c0,local_820);
    auVar222 = vmaxps_avx(local_7e0,local_800);
    auVar106 = vmaxps_avx(auVar106,auVar222);
    auVar222 = vrsqrtps_avx(auVar198);
    fVar257 = auVar222._0_4_;
    fVar204 = auVar222._4_4_;
    fVar205 = auVar222._8_4_;
    fVar206 = auVar222._12_4_;
    fVar226 = auVar222._16_4_;
    fVar227 = auVar222._20_4_;
    fVar236 = auVar222._24_4_;
    fVar315 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar198._0_4_ * -0.5;
    fVar321 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar198._4_4_ * -0.5;
    fVar324 = fVar205 * 1.5 + fVar205 * fVar205 * fVar205 * auVar198._8_4_ * -0.5;
    fVar327 = fVar206 * 1.5 + fVar206 * fVar206 * fVar206 * auVar198._12_4_ * -0.5;
    fVar330 = fVar226 * 1.5 + fVar226 * fVar226 * fVar226 * auVar198._16_4_ * -0.5;
    fVar333 = fVar227 * 1.5 + fVar227 * fVar227 * fVar227 * auVar198._20_4_ * -0.5;
    fVar336 = fVar236 * 1.5 + fVar236 * fVar236 * fVar236 * auVar198._24_4_ * -0.5;
    auVar17 = vsubps_avx(ZEXT432(0) << 0x20,auVar375);
    auVar222 = vsubps_avx(ZEXT432(0) << 0x20,auVar398);
    fVar397 = auVar222._0_4_;
    fVar400 = auVar222._4_4_;
    fVar401 = auVar222._8_4_;
    fVar402 = auVar222._12_4_;
    fVar403 = auVar222._16_4_;
    fVar404 = auVar222._20_4_;
    fVar405 = auVar222._24_4_;
    fVar257 = auVar17._0_4_;
    fVar205 = auVar17._4_4_;
    fVar226 = auVar17._8_4_;
    fVar236 = auVar17._12_4_;
    fVar261 = auVar17._16_4_;
    fVar286 = auVar17._20_4_;
    fVar230 = auVar17._24_4_;
    auVar71._4_4_ = fVar120;
    auVar71._0_4_ = fVar91;
    auVar71._8_4_ = fVar122;
    auVar71._12_4_ = fVar124;
    auVar71._16_4_ = fVar125;
    auVar71._20_4_ = fVar126;
    auVar71._24_4_ = fVar127;
    auVar71._28_4_ = fVar128;
    auVar379 = vsubps_avx(ZEXT832(0) << 0x20,auVar71);
    fVar204 = auVar379._0_4_;
    fVar206 = auVar379._4_4_;
    fVar227 = auVar379._8_4_;
    fVar254 = auVar379._12_4_;
    fVar263 = auVar379._16_4_;
    fVar288 = auVar379._20_4_;
    fVar232 = auVar379._24_4_;
    auVar364._0_4_ =
         (float)local_840._0_4_ * fVar204 +
         (float)local_860._0_4_ * fVar257 + fVar397 * (float)local_880._0_4_;
    auVar364._4_4_ =
         (float)local_840._4_4_ * fVar206 +
         (float)local_860._4_4_ * fVar205 + fVar400 * (float)local_880._4_4_;
    auVar364._8_4_ = fStack_838 * fVar227 + fStack_858 * fVar226 + fVar401 * fStack_878;
    auVar364._12_4_ = fStack_834 * fVar254 + fStack_854 * fVar236 + fVar402 * fStack_874;
    auVar364._16_4_ = fStack_830 * fVar263 + fStack_850 * fVar261 + fVar403 * fStack_870;
    auVar364._20_4_ = fStack_82c * fVar288 + fStack_84c * fVar286 + fVar404 * fStack_86c;
    auVar364._24_4_ = fStack_828 * fVar232 + fStack_848 * fVar230 + fVar405 * fStack_868;
    auVar364._28_4_ = fVar187 + auVar20._28_4_ + fVar187 + 0.0;
    auVar377._0_4_ = fVar204 * fVar204 + fVar257 * fVar257 + fVar397 * fVar397;
    auVar377._4_4_ = fVar206 * fVar206 + fVar205 * fVar205 + fVar400 * fVar400;
    auVar377._8_4_ = fVar227 * fVar227 + fVar226 * fVar226 + fVar401 * fVar401;
    auVar377._12_4_ = fVar254 * fVar254 + fVar236 * fVar236 + fVar402 * fVar402;
    auVar377._16_4_ = fVar263 * fVar263 + fVar261 * fVar261 + fVar403 * fVar403;
    auVar377._20_4_ = fVar288 * fVar288 + fVar286 * fVar286 + fVar404 * fVar404;
    auVar377._24_4_ = fVar232 * fVar232 + fVar230 * fVar230 + fVar405 * fVar405;
    auVar377._28_4_ = auVar387._28_4_ + auVar387._28_4_ + fVar187;
    fVar337 = (float)local_840._0_4_ * fVar255 * fVar315 +
              fVar315 * fVar253 * (float)local_860._0_4_ +
              fVar202 * fVar315 * (float)local_880._0_4_;
    fVar344 = (float)local_840._4_4_ * fVar278 * fVar321 +
              fVar321 * fVar262 * (float)local_860._4_4_ +
              fVar275 * fVar321 * (float)local_880._4_4_;
    fVar345 = fStack_838 * fVar209 * fVar324 +
              fVar324 * fVar207 * fStack_858 + fVar208 * fVar324 * fStack_878;
    fVar346 = fStack_834 * fVar231 * fVar327 +
              fVar327 * fVar228 * fStack_854 + fVar229 * fVar327 * fStack_874;
    fVar347 = fStack_830 * fVar259 * fVar330 +
              fVar330 * fVar256 * fStack_850 + fVar258 * fVar330 * fStack_870;
    fVar349 = fStack_82c * fVar282 * fVar333 +
              fVar333 * fVar276 * fStack_84c + fVar279 * fVar333 * fStack_86c;
    fVar351 = fStack_828 * fVar11 * fVar336 +
              fVar336 * fVar360 * fStack_848 + fVar10 * fVar336 * fStack_868;
    fVar187 = fStack_824 + fStack_844 + fStack_864;
    fVar386 = fVar204 * fVar255 * fVar315 +
              fVar315 * fVar253 * fVar257 + fVar397 * fVar202 * fVar315;
    fVar390 = fVar206 * fVar278 * fVar321 +
              fVar321 * fVar262 * fVar205 + fVar400 * fVar275 * fVar321;
    fVar391 = fVar227 * fVar209 * fVar324 +
              fVar324 * fVar207 * fVar226 + fVar401 * fVar208 * fVar324;
    fVar392 = fVar254 * fVar231 * fVar327 +
              fVar327 * fVar228 * fVar236 + fVar402 * fVar229 * fVar327;
    fVar393 = fVar263 * fVar259 * fVar330 +
              fVar330 * fVar256 * fVar261 + fVar403 * fVar258 * fVar330;
    fVar394 = fVar288 * fVar282 * fVar333 +
              fVar333 * fVar276 * fVar286 + fVar404 * fVar279 * fVar333;
    fVar395 = fVar232 * fVar11 * fVar336 + fVar336 * fVar360 * fVar230 + fVar405 * fVar10 * fVar336;
    fVar396 = fStack_844 + fVar187;
    auVar30._4_4_ = fVar344 * fVar390;
    auVar30._0_4_ = fVar337 * fVar386;
    auVar30._8_4_ = fVar345 * fVar391;
    auVar30._12_4_ = fVar346 * fVar392;
    auVar30._16_4_ = fVar347 * fVar393;
    auVar30._20_4_ = fVar349 * fVar394;
    auVar30._24_4_ = fVar351 * fVar395;
    auVar30._28_4_ = fVar187;
    auVar222 = vsubps_avx(auVar364,auVar30);
    auVar31._4_4_ = fVar390 * fVar390;
    auVar31._0_4_ = fVar386 * fVar386;
    auVar31._8_4_ = fVar391 * fVar391;
    auVar31._12_4_ = fVar392 * fVar392;
    auVar31._16_4_ = fVar393 * fVar393;
    auVar31._20_4_ = fVar394 * fVar394;
    auVar31._24_4_ = fVar395 * fVar395;
    auVar31._28_4_ = fStack_844;
    auVar18 = vsubps_avx(auVar377,auVar31);
    auVar15 = vsqrtps_avx(auVar105);
    fVar187 = (auVar15._0_4_ + auVar106._0_4_) * 1.0000002;
    fVar234 = (auVar15._4_4_ + auVar106._4_4_) * 1.0000002;
    fVar166 = (auVar15._8_4_ + auVar106._8_4_) * 1.0000002;
    fVar168 = (auVar15._12_4_ + auVar106._12_4_) * 1.0000002;
    fVar169 = (auVar15._16_4_ + auVar106._16_4_) * 1.0000002;
    fVar170 = (auVar15._20_4_ + auVar106._20_4_) * 1.0000002;
    fVar171 = (auVar15._24_4_ + auVar106._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar234 * fVar234;
    auVar32._0_4_ = fVar187 * fVar187;
    auVar32._8_4_ = fVar166 * fVar166;
    auVar32._12_4_ = fVar168 * fVar168;
    auVar32._16_4_ = fVar169 * fVar169;
    auVar32._20_4_ = fVar170 * fVar170;
    auVar32._24_4_ = fVar171 * fVar171;
    auVar32._28_4_ = auVar15._28_4_ + auVar106._28_4_;
    fVar234 = auVar222._0_4_ + auVar222._0_4_;
    fVar166 = auVar222._4_4_ + auVar222._4_4_;
    local_3e0._0_8_ = CONCAT44(fVar166,fVar234);
    local_3e0._8_4_ = auVar222._8_4_ + auVar222._8_4_;
    local_3e0._12_4_ = auVar222._12_4_ + auVar222._12_4_;
    local_3e0._16_4_ = auVar222._16_4_ + auVar222._16_4_;
    local_3e0._20_4_ = auVar222._20_4_ + auVar222._20_4_;
    local_3e0._24_4_ = auVar222._24_4_ + auVar222._24_4_;
    fVar187 = auVar222._28_4_;
    local_3e0._28_4_ = fVar187 + fVar187;
    auVar106 = vsubps_avx(auVar18,auVar32);
    auVar33._4_4_ = fVar344 * fVar344;
    auVar33._0_4_ = fVar337 * fVar337;
    auVar33._8_4_ = fVar345 * fVar345;
    auVar33._12_4_ = fVar346 * fVar346;
    auVar33._16_4_ = fVar347 * fVar347;
    auVar33._20_4_ = fVar349 * fVar349;
    auVar33._24_4_ = fVar351 * fVar351;
    auVar33._28_4_ = auVar16._28_4_;
    auVar16 = vsubps_avx(local_3a0,auVar33);
    auVar34._4_4_ = fVar166 * fVar166;
    auVar34._0_4_ = fVar234 * fVar234;
    auVar34._8_4_ = local_3e0._8_4_ * local_3e0._8_4_;
    auVar34._12_4_ = local_3e0._12_4_ * local_3e0._12_4_;
    auVar34._16_4_ = local_3e0._16_4_ * local_3e0._16_4_;
    auVar34._20_4_ = local_3e0._20_4_ * local_3e0._20_4_;
    auVar34._24_4_ = local_3e0._24_4_ * local_3e0._24_4_;
    auVar34._28_4_ = fVar187;
    fVar168 = auVar16._0_4_;
    fVar169 = auVar16._4_4_;
    fVar170 = auVar16._8_4_;
    fVar171 = auVar16._12_4_;
    fVar348 = auVar16._16_4_;
    fVar350 = auVar16._20_4_;
    fVar352 = auVar16._24_4_;
    auVar35._4_4_ = fVar169 * 4.0 * auVar106._4_4_;
    auVar35._0_4_ = fVar168 * 4.0 * auVar106._0_4_;
    auVar35._8_4_ = fVar170 * 4.0 * auVar106._8_4_;
    auVar35._12_4_ = fVar171 * 4.0 * auVar106._12_4_;
    auVar35._16_4_ = fVar348 * 4.0 * auVar106._16_4_;
    auVar35._20_4_ = fVar350 * 4.0 * auVar106._20_4_;
    auVar35._24_4_ = fVar352 * 4.0 * auVar106._24_4_;
    auVar35._28_4_ = 0x40800000;
    auVar222 = vsubps_avx(auVar34,auVar35);
    auVar105 = vcmpps_avx(auVar222,ZEXT832(0) << 0x20,5);
    fVar187 = auVar16._28_4_;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar107._8_4_ = 0x7f800000;
      auVar107._0_8_ = 0x7f8000007f800000;
      auVar107._12_4_ = 0x7f800000;
      auVar107._16_4_ = 0x7f800000;
      auVar107._20_4_ = 0x7f800000;
      auVar107._24_4_ = 0x7f800000;
      auVar107._28_4_ = 0x7f800000;
      auVar388._8_4_ = 0xff800000;
      auVar388._0_8_ = 0xff800000ff800000;
      auVar388._12_4_ = 0xff800000;
      auVar388._16_4_ = 0xff800000;
      auVar388._20_4_ = 0xff800000;
      auVar388._24_4_ = 0xff800000;
      auVar388._28_4_ = 0xff800000;
    }
    else {
      auVar21 = vsqrtps_avx(auVar222);
      auVar268._0_4_ = fVar168 + fVar168;
      auVar268._4_4_ = fVar169 + fVar169;
      auVar268._8_4_ = fVar170 + fVar170;
      auVar268._12_4_ = fVar171 + fVar171;
      auVar268._16_4_ = fVar348 + fVar348;
      auVar268._20_4_ = fVar350 + fVar350;
      auVar268._24_4_ = fVar352 + fVar352;
      auVar268._28_4_ = fVar187 + fVar187;
      auVar20 = vrcpps_avx(auVar268);
      auVar19 = vcmpps_avx(auVar222,ZEXT832(0) << 0x20,5);
      fVar264 = auVar20._0_4_;
      fVar277 = auVar20._4_4_;
      auVar36._4_4_ = auVar268._4_4_ * fVar277;
      auVar36._0_4_ = auVar268._0_4_ * fVar264;
      fVar280 = auVar20._8_4_;
      auVar36._8_4_ = auVar268._8_4_ * fVar280;
      fVar283 = auVar20._12_4_;
      auVar36._12_4_ = auVar268._12_4_ * fVar283;
      fVar285 = auVar20._16_4_;
      auVar36._16_4_ = auVar268._16_4_ * fVar285;
      fVar287 = auVar20._20_4_;
      auVar36._20_4_ = auVar268._20_4_ * fVar287;
      fVar289 = auVar20._24_4_;
      auVar36._24_4_ = auVar268._24_4_ * fVar289;
      auVar36._28_4_ = auVar268._28_4_;
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = &DAT_3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar108._16_4_ = 0x3f800000;
      auVar108._20_4_ = 0x3f800000;
      auVar108._24_4_ = 0x3f800000;
      auVar108._28_4_ = 0x3f800000;
      auVar222 = vsubps_avx(auVar108,auVar36);
      fVar264 = fVar264 + fVar264 * auVar222._0_4_;
      fVar277 = fVar277 + fVar277 * auVar222._4_4_;
      fVar280 = fVar280 + fVar280 * auVar222._8_4_;
      fVar283 = fVar283 + fVar283 * auVar222._12_4_;
      fVar285 = fVar285 + fVar285 * auVar222._16_4_;
      fVar287 = fVar287 + fVar287 * auVar222._20_4_;
      fVar289 = fVar289 + fVar289 * auVar222._24_4_;
      auVar296._0_8_ = CONCAT44(fVar166,fVar234) ^ 0x8000000080000000;
      auVar296._8_4_ = -local_3e0._8_4_;
      auVar296._12_4_ = -local_3e0._12_4_;
      auVar296._16_4_ = -local_3e0._16_4_;
      auVar296._20_4_ = -local_3e0._20_4_;
      auVar296._24_4_ = -local_3e0._24_4_;
      auVar296._28_4_ = -local_3e0._28_4_;
      auVar318 = vsubps_avx(auVar296,auVar21);
      fVar234 = auVar318._0_4_ * fVar264;
      fVar166 = auVar318._4_4_ * fVar277;
      auVar37._4_4_ = fVar166;
      auVar37._0_4_ = fVar234;
      fVar304 = auVar318._8_4_ * fVar280;
      auVar37._8_4_ = fVar304;
      fVar306 = auVar318._12_4_ * fVar283;
      auVar37._12_4_ = fVar306;
      fVar308 = auVar318._16_4_ * fVar285;
      auVar37._16_4_ = fVar308;
      fVar310 = auVar318._20_4_ * fVar287;
      auVar37._20_4_ = fVar310;
      fVar312 = auVar318._24_4_ * fVar289;
      auVar37._24_4_ = fVar312;
      auVar37._28_4_ = auVar318._28_4_;
      auVar21 = vsubps_avx(auVar21,local_3e0);
      fVar264 = auVar21._0_4_ * fVar264;
      fVar277 = auVar21._4_4_ * fVar277;
      auVar38._4_4_ = fVar277;
      auVar38._0_4_ = fVar264;
      fVar280 = auVar21._8_4_ * fVar280;
      auVar38._8_4_ = fVar280;
      fVar283 = auVar21._12_4_ * fVar283;
      auVar38._12_4_ = fVar283;
      fVar285 = auVar21._16_4_ * fVar285;
      auVar38._16_4_ = fVar285;
      fVar287 = auVar21._20_4_ * fVar287;
      auVar38._20_4_ = fVar287;
      fVar289 = auVar21._24_4_ * fVar289;
      auVar38._24_4_ = fVar289;
      auVar38._28_4_ = auVar21._28_4_;
      fStack_644 = fVar396 + auVar20._28_4_ + auVar222._28_4_;
      local_660[0] = fVar315 * (fVar386 + fVar337 * fVar234);
      local_660[1] = fVar321 * (fVar390 + fVar344 * fVar166);
      local_660[2] = fVar324 * (fVar391 + fVar345 * fVar304);
      local_660[3] = fVar327 * (fVar392 + fVar346 * fVar306);
      fStack_650 = fVar330 * (fVar393 + fVar347 * fVar308);
      fStack_64c = fVar333 * (fVar394 + fVar349 * fVar310);
      fStack_648 = fVar336 * (fVar395 + fVar351 * fVar312);
      local_680[0] = fVar315 * (fVar386 + fVar337 * fVar264);
      local_680[1] = fVar321 * (fVar390 + fVar344 * fVar277);
      local_680[2] = fVar324 * (fVar391 + fVar345 * fVar280);
      local_680[3] = fVar327 * (fVar392 + fVar346 * fVar283);
      fStack_670 = fVar330 * (fVar393 + fVar347 * fVar285);
      fStack_66c = fVar333 * (fVar394 + fVar349 * fVar287);
      fStack_668 = fVar336 * (fVar395 + fVar351 * fVar289);
      fStack_664 = fVar396 + fStack_644;
      auVar269._8_4_ = 0x7f800000;
      auVar269._0_8_ = 0x7f8000007f800000;
      auVar269._12_4_ = 0x7f800000;
      auVar269._16_4_ = 0x7f800000;
      auVar269._20_4_ = 0x7f800000;
      auVar269._24_4_ = 0x7f800000;
      auVar269._28_4_ = 0x7f800000;
      auVar107 = vblendvps_avx(auVar269,auVar37,auVar19);
      auVar297._8_4_ = 0x7fffffff;
      auVar297._0_8_ = 0x7fffffff7fffffff;
      auVar297._12_4_ = 0x7fffffff;
      auVar297._16_4_ = 0x7fffffff;
      auVar297._20_4_ = 0x7fffffff;
      auVar297._24_4_ = 0x7fffffff;
      auVar297._28_4_ = 0x7fffffff;
      auVar222 = vandps_avx(auVar33,auVar297);
      auVar222 = vmaxps_avx(local_4a0,auVar222);
      auVar39._4_4_ = auVar222._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar222._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar222._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar222._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar222._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar222._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar222._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar222._28_4_;
      auVar222 = vandps_avx(auVar16,auVar297);
      auVar222 = vcmpps_avx(auVar222,auVar39,1);
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar388 = vblendvps_avx(auVar270,auVar38,auVar19);
      auVar20 = auVar19 & auVar222;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar222,auVar19);
        auVar137 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        auVar222 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,2);
        auVar378._8_4_ = 0xff800000;
        auVar378._0_8_ = 0xff800000ff800000;
        auVar378._12_4_ = 0xff800000;
        auVar378._16_4_ = 0xff800000;
        auVar378._20_4_ = 0xff800000;
        auVar378._24_4_ = 0xff800000;
        auVar378._28_4_ = 0xff800000;
        auVar355._8_4_ = 0x7f800000;
        auVar355._0_8_ = 0x7f8000007f800000;
        auVar355._12_4_ = 0x7f800000;
        auVar355._16_4_ = 0x7f800000;
        auVar355._20_4_ = 0x7f800000;
        auVar355._24_4_ = 0x7f800000;
        auVar355._28_4_ = 0x7f800000;
        auVar106 = vblendvps_avx(auVar355,auVar378,auVar222);
        auVar12 = vpmovsxwd_avx(auVar137);
        auVar137 = vpunpckhwd_avx(auVar137,auVar137);
        auVar252._16_16_ = auVar137;
        auVar252._0_16_ = auVar12;
        auVar107 = vblendvps_avx(auVar107,auVar106,auVar252);
        auVar106 = vblendvps_avx(auVar378,auVar355,auVar222);
        auVar388 = vblendvps_avx(auVar388,auVar106,auVar252);
        auVar106 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar185._0_4_ = auVar105._0_4_ ^ auVar106._0_4_;
        auVar185._4_4_ = auVar105._4_4_ ^ auVar106._4_4_;
        auVar185._8_4_ = auVar105._8_4_ ^ auVar106._8_4_;
        auVar185._12_4_ = auVar105._12_4_ ^ auVar106._12_4_;
        auVar185._16_4_ = auVar105._16_4_ ^ auVar106._16_4_;
        auVar185._20_4_ = auVar105._20_4_ ^ auVar106._20_4_;
        auVar185._24_4_ = auVar105._24_4_ ^ auVar106._24_4_;
        auVar185._28_4_ = auVar105._28_4_ ^ auVar106._28_4_;
        auVar105 = vorps_avx(auVar222,auVar185);
        auVar105 = vandps_avx(auVar19,auVar105);
      }
    }
    auVar106 = local_480 & auVar105;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      auVar222._8_4_ = 0x3f800000;
      auVar222._0_8_ = &DAT_3f8000003f800000;
      auVar222._12_4_ = 0x3f800000;
      auVar222._16_4_ = 0x3f800000;
      auVar222._20_4_ = 0x3f800000;
      auVar222._24_4_ = 0x3f800000;
      auVar222._28_4_ = 0x3f800000;
      auVar358 = auVar33;
LAB_00f7f887:
      auVar359 = ZEXT3264(auVar358);
      auVar274 = ZEXT3264(_local_a00);
    }
    else {
      auVar137 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_
                                           )),0);
      auVar147._16_16_ = auVar137;
      auVar147._0_16_ = auVar137;
      auVar20 = vminps_avx(auVar147,auVar388);
      auVar109._0_4_ =
           (float)local_840._0_4_ * fVar290 +
           (float)local_860._0_4_ * fVar313 + fVar361 * (float)local_880._0_4_;
      auVar109._4_4_ =
           (float)local_840._4_4_ * fVar302 +
           (float)local_860._4_4_ * fVar319 + fVar366 * (float)local_880._4_4_;
      auVar109._8_4_ = fStack_838 * fVar303 + fStack_858 * fVar322 + fVar367 * fStack_878;
      auVar109._12_4_ = fStack_834 * fVar305 + fStack_854 * fVar325 + fVar368 * fStack_874;
      auVar109._16_4_ = fStack_830 * fVar307 + fStack_850 * fVar328 + fVar369 * fStack_870;
      auVar109._20_4_ = fStack_82c * fVar309 + fStack_84c * fVar331 + fVar370 * fStack_86c;
      auVar109._24_4_ = fStack_828 * fVar311 + fStack_848 * fVar334 + fVar371 * fStack_868;
      auVar109._28_4_ = auVar295._28_4_ + auVar379._28_4_ + 1.0;
      auVar106 = vrcpps_avx(auVar109);
      fVar234 = auVar106._0_4_;
      fVar166 = auVar106._4_4_;
      auVar40._4_4_ = auVar109._4_4_ * fVar166;
      auVar40._0_4_ = auVar109._0_4_ * fVar234;
      fVar264 = auVar106._8_4_;
      auVar40._8_4_ = auVar109._8_4_ * fVar264;
      fVar277 = auVar106._12_4_;
      auVar40._12_4_ = auVar109._12_4_ * fVar277;
      fVar280 = auVar106._16_4_;
      auVar40._16_4_ = auVar109._16_4_ * fVar280;
      fVar283 = auVar106._20_4_;
      auVar40._20_4_ = auVar109._20_4_ * fVar283;
      fVar285 = auVar106._24_4_;
      auVar40._24_4_ = auVar109._24_4_ * fVar285;
      auVar40._28_4_ = 0x3f800000;
      auVar222._8_4_ = 0x3f800000;
      auVar222._0_8_ = &DAT_3f8000003f800000;
      auVar222._12_4_ = 0x3f800000;
      auVar222._16_4_ = 0x3f800000;
      auVar222._20_4_ = 0x3f800000;
      auVar222._24_4_ = 0x3f800000;
      auVar222._28_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar222,auVar40);
      auVar342._8_4_ = 0x7fffffff;
      auVar342._0_8_ = 0x7fffffff7fffffff;
      auVar342._12_4_ = 0x7fffffff;
      auVar342._16_4_ = 0x7fffffff;
      auVar342._20_4_ = 0x7fffffff;
      auVar342._24_4_ = 0x7fffffff;
      auVar342._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar342,auVar109);
      auVar399._8_4_ = 0x219392ef;
      auVar399._0_8_ = 0x219392ef219392ef;
      auVar399._12_4_ = 0x219392ef;
      auVar399._16_4_ = 0x219392ef;
      auVar399._20_4_ = 0x219392ef;
      auVar399._24_4_ = 0x219392ef;
      auVar399._28_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar106,auVar399,1);
      auVar41._4_4_ =
           (fVar166 + fVar166 * auVar21._4_4_) *
           -(fVar206 * fVar302 + fVar205 * fVar319 + fVar400 * fVar366);
      auVar41._0_4_ =
           (fVar234 + fVar234 * auVar21._0_4_) *
           -(fVar204 * fVar290 + fVar257 * fVar313 + fVar397 * fVar361);
      auVar41._8_4_ =
           (fVar264 + fVar264 * auVar21._8_4_) *
           -(fVar227 * fVar303 + fVar226 * fVar322 + fVar401 * fVar367);
      auVar41._12_4_ =
           (fVar277 + fVar277 * auVar21._12_4_) *
           -(fVar254 * fVar305 + fVar236 * fVar325 + fVar402 * fVar368);
      auVar41._16_4_ =
           (fVar280 + fVar280 * auVar21._16_4_) *
           -(fVar263 * fVar307 + fVar261 * fVar328 + fVar403 * fVar369);
      auVar41._20_4_ =
           (fVar283 + fVar283 * auVar21._20_4_) *
           -(fVar288 * fVar309 + fVar286 * fVar331 + fVar404 * fVar370);
      auVar41._24_4_ =
           (fVar285 + fVar285 * auVar21._24_4_) *
           -(fVar232 * fVar311 + fVar230 * fVar334 + fVar405 * fVar371);
      auVar41._28_4_ = -(auVar379._28_4_ + auVar17._28_4_ + 1.0);
      auVar106 = vcmpps_avx(auVar109,ZEXT832(0) << 0x20,1);
      auVar106 = vorps_avx(auVar19,auVar106);
      auVar358._8_4_ = 0xff800000;
      auVar358._0_8_ = 0xff800000ff800000;
      auVar358._12_4_ = 0xff800000;
      auVar358._16_4_ = 0xff800000;
      auVar358._20_4_ = 0xff800000;
      auVar358._24_4_ = 0xff800000;
      auVar358._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar41,auVar358,auVar106);
      auVar17 = vcmpps_avx(auVar109,ZEXT832(0) << 0x20,6);
      auVar17 = vorps_avx(auVar19,auVar17);
      auVar365._8_4_ = 0x7f800000;
      auVar365._0_8_ = 0x7f8000007f800000;
      auVar365._12_4_ = 0x7f800000;
      auVar365._16_4_ = 0x7f800000;
      auVar365._20_4_ = 0x7f800000;
      auVar365._24_4_ = 0x7f800000;
      auVar365._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar41,auVar365,auVar17);
      auVar379 = vmaxps_avx(local_3c0,auVar107);
      auVar379 = vmaxps_avx(auVar379,auVar106);
      auVar17 = vminps_avx(auVar20,auVar17);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x20,local_aa0);
      auVar146 = vsubps_avx(ZEXT832(0) << 0x20,auVar146);
      auVar42._4_4_ = auVar146._4_4_ * -fVar380;
      auVar42._0_4_ = auVar146._0_4_ * -fVar373;
      auVar42._8_4_ = auVar146._8_4_ * -fVar381;
      auVar42._12_4_ = auVar146._12_4_ * -fVar382;
      auVar42._16_4_ = auVar146._16_4_ * -fVar383;
      auVar42._20_4_ = auVar146._20_4_ * -fVar384;
      auVar42._24_4_ = auVar146._24_4_ * -fVar385;
      auVar42._28_4_ = auVar146._28_4_;
      auVar43._4_4_ = fVar320 * auVar106._4_4_;
      auVar43._0_4_ = fVar314 * auVar106._0_4_;
      auVar43._8_4_ = fVar323 * auVar106._8_4_;
      auVar43._12_4_ = fVar326 * auVar106._12_4_;
      auVar43._16_4_ = fVar329 * auVar106._16_4_;
      auVar43._20_4_ = fVar332 * auVar106._20_4_;
      auVar43._24_4_ = fVar335 * auVar106._24_4_;
      auVar43._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(auVar42,auVar43);
      auVar318 = ZEXT832(0) << 0x20;
      auVar146 = vsubps_avx(auVar318,auVar14);
      auVar44._4_4_ = fVar281 * auVar146._4_4_;
      auVar44._0_4_ = fVar203 * auVar146._0_4_;
      auVar44._8_4_ = fVar210 * auVar146._8_4_;
      auVar44._12_4_ = fVar233 * auVar146._12_4_;
      auVar44._16_4_ = fVar260 * auVar146._16_4_;
      auVar44._20_4_ = fVar284 * auVar146._20_4_;
      uVar1 = auVar146._28_4_;
      auVar44._24_4_ = fVar372 * auVar146._24_4_;
      auVar44._28_4_ = uVar1;
      auVar19 = vsubps_avx(auVar106,auVar44);
      auVar45._4_4_ = (float)local_880._4_4_ * -fVar380;
      auVar45._0_4_ = (float)local_880._0_4_ * -fVar373;
      auVar45._8_4_ = fStack_878 * -fVar381;
      auVar45._12_4_ = fStack_874 * -fVar382;
      auVar45._16_4_ = fStack_870 * -fVar383;
      auVar45._20_4_ = fStack_86c * -fVar384;
      auVar45._24_4_ = fStack_868 * -fVar385;
      auVar45._28_4_ = uVar7 ^ 0x80000000;
      auVar46._4_4_ = (float)local_860._4_4_ * fVar320;
      auVar46._0_4_ = (float)local_860._0_4_ * fVar314;
      auVar46._8_4_ = fStack_858 * fVar323;
      auVar46._12_4_ = fStack_854 * fVar326;
      auVar46._16_4_ = fStack_850 * fVar329;
      auVar46._20_4_ = fStack_84c * fVar332;
      auVar46._24_4_ = fStack_848 * fVar335;
      auVar46._28_4_ = uVar1;
      auVar106 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar281 * (float)local_840._4_4_;
      auVar47._0_4_ = fVar203 * (float)local_840._0_4_;
      auVar47._8_4_ = fVar210 * fStack_838;
      auVar47._12_4_ = fVar233 * fStack_834;
      auVar47._16_4_ = fVar260 * fStack_830;
      auVar47._20_4_ = fVar284 * fStack_82c;
      auVar47._24_4_ = fVar372 * fStack_828;
      auVar47._28_4_ = uVar1;
      auVar20 = vsubps_avx(auVar106,auVar47);
      auVar106 = vrcpps_avx(auVar20);
      fVar203 = auVar106._0_4_;
      fVar257 = auVar106._4_4_;
      auVar48._4_4_ = auVar20._4_4_ * fVar257;
      auVar48._0_4_ = auVar20._0_4_ * fVar203;
      fVar204 = auVar106._8_4_;
      auVar48._8_4_ = auVar20._8_4_ * fVar204;
      fVar281 = auVar106._12_4_;
      auVar48._12_4_ = auVar20._12_4_ * fVar281;
      fVar205 = auVar106._16_4_;
      auVar48._16_4_ = auVar20._16_4_ * fVar205;
      fVar206 = auVar106._20_4_;
      auVar48._20_4_ = auVar20._20_4_ * fVar206;
      fVar210 = auVar106._24_4_;
      auVar48._24_4_ = auVar20._24_4_ * fVar210;
      auVar48._28_4_ = fStack_824;
      auVar21 = vsubps_avx(auVar222,auVar48);
      auVar271._8_4_ = 0x7fffffff;
      auVar271._0_8_ = 0x7fffffff7fffffff;
      auVar271._12_4_ = 0x7fffffff;
      auVar271._16_4_ = 0x7fffffff;
      auVar271._20_4_ = 0x7fffffff;
      auVar271._24_4_ = 0x7fffffff;
      auVar271._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar20,auVar271);
      auVar298._8_4_ = 0x219392ef;
      auVar298._0_8_ = 0x219392ef219392ef;
      auVar298._12_4_ = 0x219392ef;
      auVar298._16_4_ = 0x219392ef;
      auVar298._20_4_ = 0x219392ef;
      auVar298._24_4_ = 0x219392ef;
      auVar298._28_4_ = 0x219392ef;
      auVar146 = vcmpps_avx(auVar106,auVar298,1);
      auVar49._4_4_ = (fVar257 + fVar257 * auVar21._4_4_) * -auVar19._4_4_;
      auVar49._0_4_ = (fVar203 + fVar203 * auVar21._0_4_) * -auVar19._0_4_;
      auVar49._8_4_ = (fVar204 + fVar204 * auVar21._8_4_) * -auVar19._8_4_;
      auVar49._12_4_ = (fVar281 + fVar281 * auVar21._12_4_) * -auVar19._12_4_;
      auVar49._16_4_ = (fVar205 + fVar205 * auVar21._16_4_) * -auVar19._16_4_;
      auVar49._20_4_ = (fVar206 + fVar206 * auVar21._20_4_) * -auVar19._20_4_;
      auVar49._24_4_ = (fVar210 + fVar210 * auVar21._24_4_) * -auVar19._24_4_;
      auVar49._28_4_ = auVar19._28_4_ ^ 0x80000000;
      auVar106 = vcmpps_avx(auVar20,auVar318,1);
      auVar106 = vorps_avx(auVar146,auVar106);
      auVar106 = vblendvps_avx(auVar49,auVar358,auVar106);
      local_4c0 = vmaxps_avx(auVar379,auVar106);
      auVar106 = vcmpps_avx(auVar20,auVar318,6);
      auVar106 = vorps_avx(auVar146,auVar106);
      auVar106 = vblendvps_avx(auVar49,auVar365,auVar106);
      auVar105 = vandps_avx(auVar105,local_480);
      local_400 = vminps_avx(auVar17,auVar106);
      auVar106 = vcmpps_avx(local_4c0,local_400,2);
      auVar146 = auVar105 & auVar106;
      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar146 >> 0x7f,0) == '\0') &&
            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar146 >> 0xbf,0) == '\0') &&
          (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar146[0x1f]) goto LAB_00f7f887;
      auVar146 = vminps_avx(local_7c0,local_820);
      auVar17 = vminps_avx(local_7e0,local_800);
      auVar146 = vminps_avx(auVar146,auVar17);
      auVar146 = vsubps_avx(auVar146,auVar15);
      auVar105 = vandps_avx(auVar106,auVar105);
      auVar81._4_4_ = local_660[1];
      auVar81._0_4_ = local_660[0];
      auVar81._8_4_ = local_660[2];
      auVar81._12_4_ = local_660[3];
      auVar81._16_4_ = fStack_650;
      auVar81._20_4_ = fStack_64c;
      auVar81._24_4_ = fStack_648;
      auVar81._28_4_ = fStack_644;
      auVar106 = vminps_avx(auVar81,auVar222);
      auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      local_660[0] = fVar90 + fVar129 * (auVar106._0_4_ + 0.0) * 0.125;
      local_660[1] = fVar119 + fVar164 * (auVar106._4_4_ + 1.0) * 0.125;
      local_660[2] = fVar121 + fVar165 * (auVar106._8_4_ + 2.0) * 0.125;
      local_660[3] = fVar123 + fVar167 * (auVar106._12_4_ + 3.0) * 0.125;
      fStack_650 = fVar90 + fVar129 * (auVar106._16_4_ + 4.0) * 0.125;
      fStack_64c = fVar119 + fVar164 * (auVar106._20_4_ + 5.0) * 0.125;
      fStack_648 = fVar121 + fVar165 * (auVar106._24_4_ + 6.0) * 0.125;
      fStack_644 = fVar123 + auVar106._28_4_ + 7.0;
      auVar80._4_4_ = local_680[1];
      auVar80._0_4_ = local_680[0];
      auVar80._8_4_ = local_680[2];
      auVar80._12_4_ = local_680[3];
      auVar80._16_4_ = fStack_670;
      auVar80._20_4_ = fStack_66c;
      auVar80._24_4_ = fStack_668;
      auVar80._28_4_ = fStack_664;
      auVar106 = vminps_avx(auVar80,auVar222);
      auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      local_680[0] = fVar90 + fVar129 * (auVar106._0_4_ + 0.0) * 0.125;
      local_680[1] = fVar119 + fVar164 * (auVar106._4_4_ + 1.0) * 0.125;
      local_680[2] = fVar121 + fVar165 * (auVar106._8_4_ + 2.0) * 0.125;
      local_680[3] = fVar123 + fVar167 * (auVar106._12_4_ + 3.0) * 0.125;
      fStack_670 = fVar90 + fVar129 * (auVar106._16_4_ + 4.0) * 0.125;
      fStack_66c = fVar119 + fVar164 * (auVar106._20_4_ + 5.0) * 0.125;
      fStack_668 = fVar121 + fVar165 * (auVar106._24_4_ + 6.0) * 0.125;
      fStack_664 = fVar123 + auVar106._28_4_ + 7.0;
      auVar51._4_4_ = auVar146._4_4_ * 0.99999976;
      auVar51._0_4_ = auVar146._0_4_ * 0.99999976;
      auVar51._8_4_ = auVar146._8_4_ * 0.99999976;
      auVar51._12_4_ = auVar146._12_4_ * 0.99999976;
      auVar51._16_4_ = auVar146._16_4_ * 0.99999976;
      auVar51._20_4_ = auVar146._20_4_ * 0.99999976;
      auVar51._24_4_ = auVar146._24_4_ * 0.99999976;
      auVar51._28_4_ = 0x3f7ffffc;
      auVar106 = vmaxps_avx(auVar318,auVar51);
      auVar52._4_4_ = auVar106._4_4_ * auVar106._4_4_;
      auVar52._0_4_ = auVar106._0_4_ * auVar106._0_4_;
      auVar52._8_4_ = auVar106._8_4_ * auVar106._8_4_;
      auVar52._12_4_ = auVar106._12_4_ * auVar106._12_4_;
      auVar52._16_4_ = auVar106._16_4_ * auVar106._16_4_;
      auVar52._20_4_ = auVar106._20_4_ * auVar106._20_4_;
      auVar52._24_4_ = auVar106._24_4_ * auVar106._24_4_;
      auVar52._28_4_ = auVar106._28_4_;
      local_a60 = vsubps_avx(auVar18,auVar52);
      auVar53._4_4_ = local_a60._4_4_ * fVar169 * 4.0;
      auVar53._0_4_ = local_a60._0_4_ * fVar168 * 4.0;
      auVar53._8_4_ = local_a60._8_4_ * fVar170 * 4.0;
      auVar53._12_4_ = local_a60._12_4_ * fVar171 * 4.0;
      auVar53._16_4_ = local_a60._16_4_ * fVar348 * 4.0;
      auVar53._20_4_ = local_a60._20_4_ * fVar350 * 4.0;
      auVar53._24_4_ = local_a60._24_4_ * fVar352 * 4.0;
      auVar53._28_4_ = auVar106._28_4_;
      auVar146 = vsubps_avx(auVar34,auVar53);
      auVar106 = vcmpps_avx(auVar146,ZEXT832(0) << 0x20,5);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        _local_900 = ZEXT1232(ZEXT412(0)) << 0x20;
        _local_8c0 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar196 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar221 = ZEXT828(0) << 0x20;
        auVar363 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar148._8_4_ = 0x7f800000;
        auVar148._0_8_ = 0x7f8000007f800000;
        auVar148._12_4_ = 0x7f800000;
        auVar148._16_4_ = 0x7f800000;
        auVar148._20_4_ = 0x7f800000;
        auVar148._24_4_ = 0x7f800000;
        auVar148._28_4_ = 0x7f800000;
        auVar246._8_4_ = 0xff800000;
        auVar246._0_8_ = 0xff800000ff800000;
        auVar246._12_4_ = 0xff800000;
        auVar246._16_4_ = 0xff800000;
        auVar246._20_4_ = 0xff800000;
        auVar246._24_4_ = 0xff800000;
        auVar246._28_4_ = 0xff800000;
        local_a60 = auVar14;
        _local_8e0 = _local_900;
      }
      else {
        auVar15 = vsqrtps_avx(auVar146);
        auVar149._0_4_ = fVar168 + fVar168;
        auVar149._4_4_ = fVar169 + fVar169;
        auVar149._8_4_ = fVar170 + fVar170;
        auVar149._12_4_ = fVar171 + fVar171;
        auVar149._16_4_ = fVar348 + fVar348;
        auVar149._20_4_ = fVar350 + fVar350;
        auVar149._24_4_ = fVar352 + fVar352;
        auVar149._28_4_ = fVar187 + fVar187;
        auVar14 = vrcpps_avx(auVar149);
        fVar187 = auVar14._0_4_;
        fVar203 = auVar14._4_4_;
        auVar54._4_4_ = auVar149._4_4_ * fVar203;
        auVar54._0_4_ = auVar149._0_4_ * fVar187;
        fVar257 = auVar14._8_4_;
        auVar54._8_4_ = auVar149._8_4_ * fVar257;
        fVar204 = auVar14._12_4_;
        auVar54._12_4_ = auVar149._12_4_ * fVar204;
        fVar281 = auVar14._16_4_;
        auVar54._16_4_ = auVar149._16_4_ * fVar281;
        fVar205 = auVar14._20_4_;
        auVar54._20_4_ = auVar149._20_4_ * fVar205;
        fVar206 = auVar14._24_4_;
        auVar54._24_4_ = auVar149._24_4_ * fVar206;
        auVar54._28_4_ = auVar149._28_4_;
        auVar222 = vsubps_avx(auVar222,auVar54);
        fVar187 = fVar187 + fVar187 * auVar222._0_4_;
        fVar203 = fVar203 + fVar203 * auVar222._4_4_;
        fVar257 = fVar257 + fVar257 * auVar222._8_4_;
        fVar204 = fVar204 + fVar204 * auVar222._12_4_;
        fVar281 = fVar281 + fVar281 * auVar222._16_4_;
        fVar205 = fVar205 + fVar205 * auVar222._20_4_;
        fVar206 = fVar206 + fVar206 * auVar222._24_4_;
        fVar261 = auVar14._28_4_ + auVar222._28_4_;
        auVar150._0_8_ = local_3e0._0_8_ ^ 0x8000000080000000;
        auVar150._8_4_ = -local_3e0._8_4_;
        auVar150._12_4_ = -local_3e0._12_4_;
        auVar150._16_4_ = -local_3e0._16_4_;
        auVar150._20_4_ = -local_3e0._20_4_;
        auVar150._24_4_ = -local_3e0._24_4_;
        auVar150._28_4_ = -local_3e0._28_4_;
        auVar222 = vsubps_avx(auVar150,auVar15);
        fVar210 = auVar222._0_4_ * fVar187;
        fVar226 = auVar222._4_4_ * fVar203;
        auVar55._4_4_ = fVar226;
        auVar55._0_4_ = fVar210;
        fVar227 = auVar222._8_4_ * fVar257;
        auVar55._8_4_ = fVar227;
        fVar233 = auVar222._12_4_ * fVar204;
        auVar55._12_4_ = fVar233;
        fVar236 = auVar222._16_4_ * fVar281;
        auVar55._16_4_ = fVar236;
        fVar254 = auVar222._20_4_ * fVar205;
        auVar55._20_4_ = fVar254;
        fVar260 = auVar222._24_4_ * fVar206;
        auVar55._24_4_ = fVar260;
        auVar55._28_4_ = auVar222._28_4_;
        auVar222 = vsubps_avx(auVar15,local_3e0);
        fVar187 = auVar222._0_4_ * fVar187;
        fVar203 = auVar222._4_4_ * fVar203;
        auVar56._4_4_ = fVar203;
        auVar56._0_4_ = fVar187;
        fVar257 = auVar222._8_4_ * fVar257;
        auVar56._8_4_ = fVar257;
        fVar204 = auVar222._12_4_ * fVar204;
        auVar56._12_4_ = fVar204;
        fVar281 = auVar222._16_4_ * fVar281;
        auVar56._16_4_ = fVar281;
        fVar205 = auVar222._20_4_ * fVar205;
        auVar56._20_4_ = fVar205;
        fVar206 = auVar222._24_4_ * fVar206;
        auVar56._24_4_ = fVar206;
        auVar56._28_4_ = 0x3f800000;
        fVar263 = (fVar210 * fVar337 + fVar386) * fVar315;
        fVar284 = (fVar226 * fVar344 + fVar390) * fVar321;
        fVar286 = (fVar227 * fVar345 + fVar391) * fVar324;
        fVar288 = (fVar233 * fVar346 + fVar392) * fVar327;
        fVar372 = (fVar236 * fVar347 + fVar393) * fVar330;
        fVar230 = (fVar254 * fVar349 + fVar394) * fVar333;
        fVar232 = (fVar260 * fVar351 + fVar395) * fVar336;
        auVar200._0_4_ = fVar91 + fVar255 * fVar263;
        auVar200._4_4_ = fVar120 + fVar278 * fVar284;
        auVar200._8_4_ = fVar122 + fVar209 * fVar286;
        auVar200._12_4_ = fVar124 + fVar231 * fVar288;
        auVar200._16_4_ = fVar125 + fVar259 * fVar372;
        auVar200._20_4_ = fVar126 + fVar282 * fVar230;
        auVar200._24_4_ = fVar127 + fVar11 * fVar232;
        auVar200._28_4_ = fVar128 + auVar222._28_4_ + fVar396;
        auVar57._4_4_ = (float)local_840._4_4_ * fVar226;
        auVar57._0_4_ = (float)local_840._0_4_ * fVar210;
        auVar57._8_4_ = fStack_838 * fVar227;
        auVar57._12_4_ = fStack_834 * fVar233;
        auVar57._16_4_ = fStack_830 * fVar236;
        auVar57._20_4_ = fStack_82c * fVar254;
        auVar57._24_4_ = fStack_828 * fVar260;
        auVar57._28_4_ = fVar261;
        auVar14 = vsubps_avx(auVar57,auVar200);
        auVar224._0_4_ = auVar375._0_4_ + fVar253 * fVar263;
        auVar224._4_4_ = auVar375._4_4_ + fVar262 * fVar284;
        auVar224._8_4_ = auVar375._8_4_ + fVar207 * fVar286;
        auVar224._12_4_ = auVar375._12_4_ + fVar228 * fVar288;
        auVar224._16_4_ = auVar375._16_4_ + fVar256 * fVar372;
        auVar224._20_4_ = auVar375._20_4_ + fVar276 * fVar230;
        auVar224._24_4_ = auVar375._24_4_ + fVar360 * fVar232;
        auVar224._28_4_ = auVar375._28_4_ + fVar261;
        auVar58._4_4_ = (float)local_860._4_4_ * fVar226;
        auVar58._0_4_ = (float)local_860._0_4_ * fVar210;
        auVar58._8_4_ = fStack_858 * fVar227;
        auVar58._12_4_ = fStack_854 * fVar233;
        auVar58._16_4_ = fStack_850 * fVar236;
        auVar58._20_4_ = fStack_84c * fVar254;
        auVar58._24_4_ = fStack_848 * fVar260;
        auVar58._28_4_ = fStack_9e4;
        auVar15 = vsubps_avx(auVar58,auVar224);
        auVar247._0_4_ = auVar398._0_4_ + fVar202 * fVar263;
        auVar247._4_4_ = auVar398._4_4_ + fVar275 * fVar284;
        auVar247._8_4_ = auVar398._8_4_ + fVar208 * fVar286;
        auVar247._12_4_ = auVar398._12_4_ + fVar229 * fVar288;
        auVar247._16_4_ = auVar398._16_4_ + fVar258 * fVar372;
        auVar247._20_4_ = auVar398._20_4_ + fVar279 * fVar230;
        auVar247._24_4_ = auVar398._24_4_ + fVar10 * fVar232;
        auVar247._28_4_ = auVar398._28_4_ + 0.0;
        auVar59._4_4_ = (float)local_880._4_4_ * fVar226;
        auVar59._0_4_ = (float)local_880._0_4_ * fVar210;
        auVar59._8_4_ = fStack_878 * fVar227;
        auVar59._12_4_ = fStack_874 * fVar233;
        auVar59._16_4_ = fStack_870 * fVar236;
        auVar59._20_4_ = fStack_86c * fVar254;
        auVar59._24_4_ = fStack_868 * fVar260;
        auVar59._28_4_ = fStack_9e4;
        local_980 = vsubps_avx(auVar59,auVar247);
        fVar315 = (fVar187 * fVar337 + fVar386) * fVar315;
        fVar321 = (fVar203 * fVar344 + fVar390) * fVar321;
        fVar324 = (fVar257 * fVar345 + fVar391) * fVar324;
        fVar327 = (fVar204 * fVar346 + fVar392) * fVar327;
        fVar330 = (fVar281 * fVar347 + fVar393) * fVar330;
        fVar333 = (fVar205 * fVar349 + fVar394) * fVar333;
        fVar336 = (fVar206 * fVar351 + fVar395) * fVar336;
        auVar272._0_4_ = fVar91 + fVar255 * fVar315;
        auVar272._4_4_ = fVar120 + fVar278 * fVar321;
        auVar272._8_4_ = fVar122 + fVar209 * fVar324;
        auVar272._12_4_ = fVar124 + fVar231 * fVar327;
        auVar272._16_4_ = fVar125 + fVar259 * fVar330;
        auVar272._20_4_ = fVar126 + fVar282 * fVar333;
        auVar272._24_4_ = fVar127 + fVar11 * fVar336;
        auVar272._28_4_ = fVar128 + fStack_9e4;
        auVar60._4_4_ = fVar203 * (float)local_840._4_4_;
        auVar60._0_4_ = fVar187 * (float)local_840._0_4_;
        auVar60._8_4_ = fVar257 * fStack_838;
        auVar60._12_4_ = fVar204 * fStack_834;
        auVar60._16_4_ = fVar281 * fStack_830;
        auVar60._20_4_ = fVar205 * fStack_82c;
        auVar60._24_4_ = fVar206 * fStack_828;
        auVar60._28_4_ = fStack_824;
        _local_8e0 = vsubps_avx(auVar60,auVar272);
        auVar273._0_4_ = auVar375._0_4_ + fVar253 * fVar315;
        auVar273._4_4_ = auVar375._4_4_ + fVar262 * fVar321;
        auVar273._8_4_ = auVar375._8_4_ + fVar207 * fVar324;
        auVar273._12_4_ = auVar375._12_4_ + fVar228 * fVar327;
        auVar273._16_4_ = auVar375._16_4_ + fVar256 * fVar330;
        auVar273._20_4_ = auVar375._20_4_ + fVar276 * fVar333;
        auVar273._24_4_ = auVar375._24_4_ + fVar360 * fVar336;
        auVar273._28_4_ = auVar375._28_4_ + local_8e0._28_4_;
        auVar61._4_4_ = (float)local_860._4_4_ * fVar203;
        auVar61._0_4_ = (float)local_860._0_4_ * fVar187;
        auVar61._8_4_ = fStack_858 * fVar257;
        auVar61._12_4_ = fStack_854 * fVar204;
        auVar61._16_4_ = fStack_850 * fVar281;
        auVar61._20_4_ = fStack_84c * fVar205;
        auVar61._24_4_ = fStack_848 * fVar206;
        auVar61._28_4_ = fStack_824;
        _local_900 = vsubps_avx(auVar61,auVar273);
        auVar248._0_4_ = auVar398._0_4_ + fVar202 * fVar315;
        auVar248._4_4_ = auVar398._4_4_ + fVar275 * fVar321;
        auVar248._8_4_ = auVar398._8_4_ + fVar208 * fVar324;
        auVar248._12_4_ = auVar398._12_4_ + fVar229 * fVar327;
        auVar248._16_4_ = auVar398._16_4_ + fVar258 * fVar330;
        auVar248._20_4_ = auVar398._20_4_ + fVar279 * fVar333;
        auVar248._24_4_ = auVar398._24_4_ + fVar10 * fVar336;
        auVar248._28_4_ = auVar398._28_4_ + local_980._28_4_ + fVar396;
        auVar62._4_4_ = (float)local_880._4_4_ * fVar203;
        auVar62._0_4_ = (float)local_880._0_4_ * fVar187;
        auVar62._8_4_ = fStack_878 * fVar257;
        auVar62._12_4_ = fStack_874 * fVar204;
        auVar62._16_4_ = fStack_870 * fVar281;
        auVar62._20_4_ = fStack_86c * fVar205;
        auVar62._24_4_ = fStack_868 * fVar206;
        auVar62._28_4_ = local_900._28_4_;
        _local_8c0 = vsubps_avx(auVar62,auVar248);
        auVar146 = vcmpps_avx(auVar146,ZEXT832(0) << 0x20,5);
        auVar249._8_4_ = 0x7f800000;
        auVar249._0_8_ = 0x7f8000007f800000;
        auVar249._12_4_ = 0x7f800000;
        auVar249._16_4_ = 0x7f800000;
        auVar249._20_4_ = 0x7f800000;
        auVar249._24_4_ = 0x7f800000;
        auVar249._28_4_ = 0x7f800000;
        auVar148 = vblendvps_avx(auVar249,auVar55,auVar146);
        auVar299._8_4_ = 0x7fffffff;
        auVar299._0_8_ = 0x7fffffff7fffffff;
        auVar299._12_4_ = 0x7fffffff;
        auVar299._16_4_ = 0x7fffffff;
        auVar299._20_4_ = 0x7fffffff;
        auVar299._24_4_ = 0x7fffffff;
        auVar299._28_4_ = 0x7fffffff;
        auVar222 = vandps_avx(auVar299,auVar33);
        auVar222 = vmaxps_avx(local_4a0,auVar222);
        auVar63._4_4_ = auVar222._4_4_ * 1.9073486e-06;
        auVar63._0_4_ = auVar222._0_4_ * 1.9073486e-06;
        auVar63._8_4_ = auVar222._8_4_ * 1.9073486e-06;
        auVar63._12_4_ = auVar222._12_4_ * 1.9073486e-06;
        auVar63._16_4_ = auVar222._16_4_ * 1.9073486e-06;
        auVar63._20_4_ = auVar222._20_4_ * 1.9073486e-06;
        auVar63._24_4_ = auVar222._24_4_ * 1.9073486e-06;
        auVar63._28_4_ = auVar222._28_4_;
        auVar222 = vandps_avx(auVar299,auVar16);
        auVar222 = vcmpps_avx(auVar222,auVar63,1);
        auVar250._8_4_ = 0xff800000;
        auVar250._0_8_ = 0xff800000ff800000;
        auVar250._12_4_ = 0xff800000;
        auVar250._16_4_ = 0xff800000;
        auVar250._20_4_ = 0xff800000;
        auVar250._24_4_ = 0xff800000;
        auVar250._28_4_ = 0xff800000;
        auVar246 = vblendvps_avx(auVar250,auVar56,auVar146);
        auVar17 = auVar146 & auVar222;
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0x7f,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0xbf,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar17[0x1f] < '\0') {
          auVar106 = vandps_avx(auVar222,auVar146);
          auVar137 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
          auVar379 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar17 = vcmpps_avx(local_a60,auVar379,2);
          auVar389._8_4_ = 0xff800000;
          auVar389._0_8_ = 0xff800000ff800000;
          auVar389._12_4_ = 0xff800000;
          auVar389._16_4_ = 0xff800000;
          auVar389._20_4_ = 0xff800000;
          auVar389._24_4_ = 0xff800000;
          auVar389._28_4_ = 0xff800000;
          auVar343._8_4_ = 0x7f800000;
          auVar343._0_8_ = 0x7f8000007f800000;
          auVar343._12_4_ = 0x7f800000;
          auVar343._16_4_ = 0x7f800000;
          auVar343._20_4_ = 0x7f800000;
          auVar343._24_4_ = 0x7f800000;
          auVar343._28_4_ = 0x7f800000;
          auVar222 = vblendvps_avx(auVar343,auVar389,auVar17);
          auVar12 = vpmovsxwd_avx(auVar137);
          auVar137 = vpunpckhwd_avx(auVar137,auVar137);
          auVar300._16_16_ = auVar137;
          auVar300._0_16_ = auVar12;
          auVar148 = vblendvps_avx(auVar148,auVar222,auVar300);
          auVar222 = vblendvps_avx(auVar389,auVar343,auVar17);
          auVar246 = vblendvps_avx(auVar246,auVar222,auVar300);
          auVar222 = vcmpps_avx(auVar379,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar186._0_4_ = auVar106._0_4_ ^ auVar222._0_4_;
          auVar186._4_4_ = auVar106._4_4_ ^ auVar222._4_4_;
          auVar186._8_4_ = auVar106._8_4_ ^ auVar222._8_4_;
          auVar186._12_4_ = auVar106._12_4_ ^ auVar222._12_4_;
          auVar186._16_4_ = auVar106._16_4_ ^ auVar222._16_4_;
          auVar186._20_4_ = auVar106._20_4_ ^ auVar222._20_4_;
          auVar186._24_4_ = auVar106._24_4_ ^ auVar222._24_4_;
          auVar186._28_4_ = auVar106._28_4_ ^ auVar222._28_4_;
          auVar106 = vorps_avx(auVar17,auVar186);
          auVar106 = vandps_avx(auVar146,auVar106);
        }
        auVar196 = auVar14._0_28_;
        auVar221 = auVar15._0_28_;
        auVar363 = local_980._0_28_;
        local_aa0 = auVar105;
      }
      auVar359 = ZEXT3264(auVar105);
      auVar274 = ZEXT3264(_local_a00);
      _local_460 = local_4c0;
      local_440 = vminps_avx(local_400,auVar148);
      _local_420 = vmaxps_avx(local_4c0,auVar246);
      auVar222 = vcmpps_avx(local_4c0,local_440,2);
      local_780 = vandps_avx(auVar105,auVar222);
      auVar222 = vcmpps_avx(_local_420,local_400,2);
      local_740 = vandps_avx(auVar105,auVar222);
      auVar105 = vorps_avx(local_740,local_780);
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0x7f,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0xbf,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar105[0x1f]) {
LAB_00f7fd9e:
        auVar222._8_4_ = 0x3f800000;
        auVar222._0_8_ = &DAT_3f8000003f800000;
        auVar222._12_4_ = 0x3f800000;
        auVar222._16_4_ = 0x3f800000;
        auVar222._20_4_ = 0x3f800000;
        auVar222._24_4_ = 0x3f800000;
        auVar222._28_4_ = 0x3f800000;
      }
      else {
        local_9a0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_700._0_4_ = auVar106._0_4_ ^ local_9a0._0_4_;
        local_700._4_4_ = auVar106._4_4_ ^ local_9a0._4_4_;
        local_700._8_4_ = auVar106._8_4_ ^ local_9a0._8_4_;
        local_700._12_4_ = auVar106._12_4_ ^ local_9a0._12_4_;
        local_700._16_4_ = auVar106._16_4_ ^ local_9a0._16_4_;
        local_700._20_4_ = auVar106._20_4_ ^ local_9a0._20_4_;
        local_700._24_4_ = auVar106._24_4_ ^ local_9a0._24_4_;
        local_700._28_4_ = (uint)auVar106._28_4_ ^ (uint)local_9a0._28_4_;
        auVar111._0_4_ =
             auVar196._0_4_ * (float)local_840._0_4_ +
             auVar221._0_4_ * (float)local_860._0_4_ + auVar363._0_4_ * (float)local_880._0_4_;
        auVar111._4_4_ =
             auVar196._4_4_ * (float)local_840._4_4_ +
             auVar221._4_4_ * (float)local_860._4_4_ + auVar363._4_4_ * (float)local_880._4_4_;
        auVar111._8_4_ =
             auVar196._8_4_ * fStack_838 + auVar221._8_4_ * fStack_858 + auVar363._8_4_ * fStack_878
        ;
        auVar111._12_4_ =
             auVar196._12_4_ * fStack_834 +
             auVar221._12_4_ * fStack_854 + auVar363._12_4_ * fStack_874;
        auVar111._16_4_ =
             auVar196._16_4_ * fStack_830 +
             auVar221._16_4_ * fStack_850 + auVar363._16_4_ * fStack_870;
        auVar111._20_4_ =
             auVar196._20_4_ * fStack_82c +
             auVar221._20_4_ * fStack_84c + auVar363._20_4_ * fStack_86c;
        auVar111._24_4_ =
             auVar196._24_4_ * fStack_828 +
             auVar221._24_4_ * fStack_848 + auVar363._24_4_ * fStack_868;
        auVar111._28_4_ = local_9a0._28_4_ + local_780._28_4_ + auVar106._28_4_;
        auVar151._8_4_ = 0x7fffffff;
        auVar151._0_8_ = 0x7fffffff7fffffff;
        auVar151._12_4_ = 0x7fffffff;
        auVar151._16_4_ = 0x7fffffff;
        auVar151._20_4_ = 0x7fffffff;
        auVar151._24_4_ = 0x7fffffff;
        auVar151._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar111,auVar151);
        auVar152._8_4_ = 0x3e99999a;
        auVar152._0_8_ = 0x3e99999a3e99999a;
        auVar152._12_4_ = 0x3e99999a;
        auVar152._16_4_ = 0x3e99999a;
        auVar152._20_4_ = 0x3e99999a;
        auVar152._24_4_ = 0x3e99999a;
        auVar152._28_4_ = 0x3e99999a;
        auVar105 = vcmpps_avx(auVar105,auVar152,1);
        auVar105 = vorps_avx(auVar105,local_700);
        auVar153._8_4_ = 3;
        auVar153._0_8_ = 0x300000003;
        auVar153._12_4_ = 3;
        auVar153._16_4_ = 3;
        auVar153._20_4_ = 3;
        auVar153._24_4_ = 3;
        auVar153._28_4_ = 3;
        auVar181._8_4_ = 2;
        auVar181._0_8_ = 0x200000002;
        auVar181._12_4_ = 2;
        auVar181._16_4_ = 2;
        auVar181._20_4_ = 2;
        auVar181._24_4_ = 2;
        auVar181._28_4_ = 2;
        auVar105 = vblendvps_avx(auVar181,auVar153,auVar105);
        local_6e0 = ZEXT432((uint)uVar88);
        local_7a0 = vpshufd_avx(ZEXT416((uint)uVar88),0);
        auVar137 = vpcmpgtd_avx(auVar105._16_16_,local_7a0);
        auStack_790 = auVar16._16_16_;
        auVar12 = vpcmpgtd_avx(auVar105._0_16_,local_7a0);
        auVar154._16_16_ = auVar137;
        auVar154._0_16_ = auVar12;
        local_6a0 = vblendps_avx(ZEXT1632(auVar12),auVar154,0xf0);
        auVar105 = vandnps_avx(local_6a0,local_780);
        auVar106 = local_780 & ~local_6a0;
        auVar201 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        auStack_758 = auVar18._8_24_;
        local_760 = uVar88;
        auVar222 = _local_420;
        local_720 = auVar105;
        local_6c0 = local_740;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          local_8a0._4_4_ = local_4c0._4_4_ + (float)local_a00._4_4_;
          local_8a0._0_4_ = local_4c0._0_4_ + (float)local_a00._0_4_;
          fStack_898 = local_4c0._8_4_ + fStack_9f8;
          fStack_894 = local_4c0._12_4_ + fStack_9f4;
          fStack_890 = local_4c0._16_4_ + fStack_9f0;
          fStack_88c = local_4c0._20_4_ + fStack_9ec;
          fStack_888 = local_4c0._24_4_ + fStack_9e8;
          fStack_884 = local_4c0._28_4_ + fStack_9e4;
          local_a20 = _local_420;
          do {
            auVar213 = auVar201._0_16_;
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar155,local_4c0,auVar105);
            auVar222 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar222 = vminps_avx(auVar106,auVar222);
            auVar146 = vshufpd_avx(auVar222,auVar222,5);
            auVar222 = vminps_avx(auVar222,auVar146);
            auVar146 = vperm2f128_avx(auVar222,auVar222,1);
            auVar222 = vminps_avx(auVar222,auVar146);
            auVar222 = vcmpps_avx(auVar106,auVar222,0);
            auVar146 = auVar105 & auVar222;
            auVar106 = auVar105;
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0x7f,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0xbf,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar146[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar222,auVar105);
            }
            uVar87 = vmovmskps_avx(auVar106);
            uVar7 = 0;
            if (uVar87 != 0) {
              for (; (uVar87 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            uVar88 = (ulong)uVar7;
            local_720 = auVar105;
            *(undefined4 *)(local_720 + uVar88 * 4) = 0;
            fVar187 = local_660[uVar88];
            uVar7 = *(uint *)(local_460 + uVar88 * 4);
            fVar253 = auVar132._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar253 = sqrtf((float)local_9c0._0_4_);
              auVar213._8_4_ = 0x7fffffff;
              auVar213._0_8_ = 0x7fffffff7fffffff;
              auVar213._12_4_ = 0x7fffffff;
            }
            auVar359 = ZEXT464(uVar7);
            auVar12 = vminps_avx(_local_ae0,_local_b00);
            auVar137 = vmaxps_avx(_local_ae0,_local_b00);
            auVar13 = vminps_avx(_local_af0,_local_b10);
            auVar96 = vminps_avx(auVar12,auVar13);
            auVar12 = vmaxps_avx(_local_af0,_local_b10);
            auVar13 = vmaxps_avx(auVar137,auVar12);
            auVar137 = vandps_avx(auVar96,auVar213);
            auVar12 = vandps_avx(auVar13,auVar213);
            auVar137 = vmaxps_avx(auVar137,auVar12);
            auVar12 = vmovshdup_avx(auVar137);
            auVar12 = vmaxss_avx(auVar12,auVar137);
            auVar137 = vshufpd_avx(auVar137,auVar137,1);
            auVar137 = vmaxss_avx(auVar137,auVar12);
            local_aa0._0_4_ = auVar137._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar253 * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar13,auVar13,0xff);
            lVar86 = 4;
            do {
              fVar257 = 1.0 - fVar187;
              auVar137 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
              fVar253 = auVar137._0_4_;
              fVar202 = auVar137._4_4_;
              fVar255 = auVar137._8_4_;
              fVar203 = auVar137._12_4_;
              auVar137 = vshufps_avx(ZEXT416((uint)fVar257),ZEXT416((uint)fVar257),0);
              fVar204 = auVar137._0_4_;
              fVar262 = auVar137._4_4_;
              fVar275 = auVar137._8_4_;
              fVar278 = auVar137._12_4_;
              fVar281 = (float)local_af0._0_4_ * fVar253 + (float)local_b00._0_4_ * fVar204;
              fVar205 = (float)local_af0._4_4_ * fVar202 + (float)local_b00._4_4_ * fVar262;
              fVar206 = fStack_ae8 * fVar255 + fStack_af8 * fVar275;
              fVar207 = fStack_ae4 * fVar203 + fStack_af4 * fVar278;
              auVar240._0_4_ =
                   fVar204 * ((float)local_b00._0_4_ * fVar253 + fVar204 * (float)local_ae0._0_4_) +
                   fVar253 * fVar281;
              auVar240._4_4_ =
                   fVar262 * ((float)local_b00._4_4_ * fVar202 + fVar262 * (float)local_ae0._4_4_) +
                   fVar202 * fVar205;
              auVar240._8_4_ =
                   fVar275 * (fStack_af8 * fVar255 + fVar275 * fStack_ad8) + fVar255 * fVar206;
              auVar240._12_4_ =
                   fVar278 * (fStack_af4 * fVar203 + fVar278 * fStack_ad4) + fVar203 * fVar207;
              auVar190._0_4_ =
                   fVar204 * fVar281 +
                   fVar253 * (fVar253 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar204);
              auVar190._4_4_ =
                   fVar262 * fVar205 +
                   fVar202 * (fVar202 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar262);
              auVar190._8_4_ =
                   fVar275 * fVar206 + fVar255 * (fVar255 * fStack_b08 + fStack_ae8 * fVar275);
              auVar190._12_4_ =
                   fVar278 * fVar207 + fVar203 * (fVar203 * fStack_b04 + fStack_ae4 * fVar278);
              auVar137 = vshufps_avx(auVar359._0_16_,auVar359._0_16_,0);
              auVar133._0_4_ = auVar137._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar133._4_4_ = auVar137._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar133._8_4_ = auVar137._8_4_ * fStack_9a8 + 0.0;
              auVar133._12_4_ = auVar137._12_4_ * fStack_9a4 + 0.0;
              auVar95._0_4_ = fVar204 * auVar240._0_4_ + fVar253 * auVar190._0_4_;
              auVar95._4_4_ = fVar262 * auVar240._4_4_ + fVar202 * auVar190._4_4_;
              auVar95._8_4_ = fVar275 * auVar240._8_4_ + fVar255 * auVar190._8_4_;
              auVar95._12_4_ = fVar278 * auVar240._12_4_ + fVar203 * auVar190._12_4_;
              local_980._0_16_ = auVar95;
              auVar12 = vsubps_avx(auVar133,auVar95);
              auVar137 = vdpps_avx(auVar12,auVar12,0x7f);
              fVar253 = auVar137._0_4_;
              if (fVar253 < 0.0) {
                local_a60._0_16_ = auVar190;
                fVar202 = sqrtf(fVar253);
                auVar190 = local_a60._0_16_;
              }
              else {
                auVar13 = vsqrtss_avx(auVar137,auVar137);
                fVar202 = auVar13._0_4_;
              }
              auVar13 = vsubps_avx(auVar190,auVar240);
              auVar266._0_4_ = auVar13._0_4_ * 3.0;
              auVar266._4_4_ = auVar13._4_4_ * 3.0;
              auVar266._8_4_ = auVar13._8_4_ * 3.0;
              auVar266._12_4_ = auVar13._12_4_ * 3.0;
              auVar13 = vshufps_avx(ZEXT416((uint)(fVar187 * 6.0)),ZEXT416((uint)(fVar187 * 6.0)),0)
              ;
              auVar96 = ZEXT416((uint)((fVar257 - (fVar187 + fVar187)) * 6.0));
              auVar93 = vshufps_avx(auVar96,auVar96,0);
              auVar96 = ZEXT416((uint)((fVar187 - (fVar257 + fVar257)) * 6.0));
              auVar131 = vshufps_avx(auVar96,auVar96,0);
              auVar92 = vshufps_avx(ZEXT416((uint)(fVar257 * 6.0)),ZEXT416((uint)(fVar257 * 6.0)),0)
              ;
              auVar96 = vdpps_avx(auVar266,auVar266,0x7f);
              auVar134._0_4_ =
                   auVar92._0_4_ * (float)local_ae0._0_4_ +
                   auVar131._0_4_ * (float)local_b00._0_4_ +
                   auVar13._0_4_ * (float)local_b10._0_4_ + auVar93._0_4_ * (float)local_af0._0_4_;
              auVar134._4_4_ =
                   auVar92._4_4_ * (float)local_ae0._4_4_ +
                   auVar131._4_4_ * (float)local_b00._4_4_ +
                   auVar13._4_4_ * (float)local_b10._4_4_ + auVar93._4_4_ * (float)local_af0._4_4_;
              auVar134._8_4_ =
                   auVar92._8_4_ * fStack_ad8 +
                   auVar131._8_4_ * fStack_af8 +
                   auVar13._8_4_ * fStack_b08 + auVar93._8_4_ * fStack_ae8;
              auVar134._12_4_ =
                   auVar92._12_4_ * fStack_ad4 +
                   auVar131._12_4_ * fStack_af4 +
                   auVar13._12_4_ * fStack_b04 + auVar93._12_4_ * fStack_ae4;
              auVar13 = vblendps_avx(auVar96,_DAT_01feba10,0xe);
              auVar93 = vrsqrtss_avx(auVar13,auVar13);
              fVar203 = auVar93._0_4_;
              fVar255 = auVar96._0_4_;
              auVar93 = vdpps_avx(auVar266,auVar134,0x7f);
              auVar131 = vshufps_avx(auVar96,auVar96,0);
              auVar135._0_4_ = auVar134._0_4_ * auVar131._0_4_;
              auVar135._4_4_ = auVar134._4_4_ * auVar131._4_4_;
              auVar135._8_4_ = auVar134._8_4_ * auVar131._8_4_;
              auVar135._12_4_ = auVar134._12_4_ * auVar131._12_4_;
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar214._0_4_ = auVar266._0_4_ * auVar93._0_4_;
              auVar214._4_4_ = auVar266._4_4_ * auVar93._4_4_;
              auVar214._8_4_ = auVar266._8_4_ * auVar93._8_4_;
              auVar214._12_4_ = auVar266._12_4_ * auVar93._12_4_;
              auVar92 = vsubps_avx(auVar135,auVar214);
              auVar93 = vrcpss_avx(auVar13,auVar13);
              auVar13 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                   ZEXT416((uint)(auVar359._0_4_ * (float)local_940._0_4_)));
              auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar255 * auVar93._0_4_)));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              uVar88 = CONCAT44(auVar266._4_4_,auVar266._0_4_);
              local_a80._0_8_ = uVar88 ^ 0x8000000080000000;
              local_a80._8_4_ = -auVar266._8_4_;
              local_a80._12_4_ = -auVar266._12_4_;
              auVar131 = ZEXT416((uint)(fVar203 * 1.5 + fVar255 * -0.5 * fVar203 * fVar203 * fVar203
                                       ));
              auVar131 = vshufps_avx(auVar131,auVar131,0);
              auVar191._0_4_ = auVar131._0_4_ * auVar92._0_4_ * auVar93._0_4_;
              auVar191._4_4_ = auVar131._4_4_ * auVar92._4_4_ * auVar93._4_4_;
              auVar191._8_4_ = auVar131._8_4_ * auVar92._8_4_ * auVar93._8_4_;
              auVar191._12_4_ = auVar131._12_4_ * auVar92._12_4_ * auVar93._12_4_;
              auVar340._0_4_ = auVar266._0_4_ * auVar131._0_4_;
              auVar340._4_4_ = auVar266._4_4_ * auVar131._4_4_;
              auVar340._8_4_ = auVar266._8_4_ * auVar131._8_4_;
              auVar340._12_4_ = auVar266._12_4_ * auVar131._12_4_;
              if (fVar255 < 0.0) {
                local_a60._0_4_ = fVar202;
                local_9e0._0_16_ = auVar340;
                local_960._0_16_ = auVar191;
                fVar255 = sqrtf(fVar255);
                auVar191 = local_960._0_16_;
                auVar340 = local_9e0._0_16_;
                fVar202 = (float)local_a60._0_4_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar255 = auVar96._0_4_;
              }
              auVar96 = vdpps_avx(auVar12,auVar340,0x7f);
              local_a60._0_4_ =
                   ((float)local_aa0._0_4_ / fVar255) * (fVar202 + 1.0) +
                   auVar13._0_4_ + fVar202 * (float)local_aa0._0_4_;
              auVar93 = vdpps_avx(local_a80._0_16_,auVar340,0x7f);
              auVar131 = vdpps_avx(auVar12,auVar191,0x7f);
              auVar92 = vdpps_avx(_local_9b0,auVar340,0x7f);
              auVar130 = vdpps_avx(auVar12,local_a80._0_16_,0x7f);
              fVar202 = auVar93._0_4_ + auVar131._0_4_;
              fVar255 = auVar96._0_4_;
              auVar97._0_4_ = fVar255 * fVar255;
              auVar97._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar97._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar97._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar131 = vsubps_avx(auVar137,auVar97);
              local_a80._0_16_ = ZEXT416((uint)fVar202);
              auVar93 = vdpps_avx(auVar12,_local_9b0,0x7f);
              fVar203 = auVar130._0_4_ - fVar255 * fVar202;
              fVar255 = auVar93._0_4_ - fVar255 * auVar92._0_4_;
              auVar93 = vrsqrtss_avx(auVar131,auVar131);
              fVar257 = auVar131._0_4_;
              fVar202 = auVar93._0_4_;
              fVar202 = fVar202 * 1.5 + fVar257 * -0.5 * fVar202 * fVar202 * fVar202;
              if (fVar257 < 0.0) {
                local_9e0._0_16_ = auVar96;
                local_960._0_16_ = auVar92;
                local_7c0._0_4_ = fVar203;
                local_7e0._0_4_ = fVar255;
                local_800._0_4_ = fVar202;
                fVar257 = sqrtf(fVar257);
                fVar202 = (float)local_800._0_4_;
                fVar203 = (float)local_7c0._0_4_;
                fVar255 = (float)local_7e0._0_4_;
                auVar92 = local_960._0_16_;
                auVar96 = local_9e0._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(auVar131,auVar131);
                fVar257 = auVar93._0_4_;
              }
              auVar131 = vpermilps_avx(local_980._0_16_,0xff);
              auVar130 = vshufps_avx(auVar266,auVar266,0xff);
              fVar203 = fVar203 * fVar202 - auVar130._0_4_;
              auVar215._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar215._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar215._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar241._0_4_ = -fVar203;
              auVar241._4_4_ = 0x80000000;
              auVar241._8_4_ = 0x80000000;
              auVar241._12_4_ = 0x80000000;
              auVar93 = vinsertps_avx(ZEXT416((uint)(fVar255 * fVar202)),auVar215,0x10);
              auVar92 = vmovsldup_avx(ZEXT416((uint)(local_a80._0_4_ * fVar255 * fVar202 -
                                                    auVar92._0_4_ * fVar203)));
              auVar93 = vdivps_avx(auVar93,auVar92);
              auVar136 = ZEXT416((uint)(fVar257 - auVar131._0_4_));
              auVar131 = vinsertps_avx(auVar96,auVar136,0x10);
              auVar192._0_4_ = auVar131._0_4_ * auVar93._0_4_;
              auVar192._4_4_ = auVar131._4_4_ * auVar93._4_4_;
              auVar192._8_4_ = auVar131._8_4_ * auVar93._8_4_;
              auVar192._12_4_ = auVar131._12_4_ * auVar93._12_4_;
              auVar93 = vinsertps_avx(auVar241,local_a80._0_16_,0x1c);
              auVar93 = vdivps_avx(auVar93,auVar92);
              auVar174._0_4_ = auVar131._0_4_ * auVar93._0_4_;
              auVar174._4_4_ = auVar131._4_4_ * auVar93._4_4_;
              auVar174._8_4_ = auVar131._8_4_ * auVar93._8_4_;
              auVar174._12_4_ = auVar131._12_4_ * auVar93._12_4_;
              auVar93 = vhaddps_avx(auVar192,auVar192);
              auVar131 = vhaddps_avx(auVar174,auVar174);
              fVar187 = fVar187 - auVar93._0_4_;
              fVar202 = auVar359._0_4_ - auVar131._0_4_;
              auVar359 = ZEXT464((uint)fVar202);
              auVar216._8_4_ = 0x7fffffff;
              auVar216._0_8_ = 0x7fffffff7fffffff;
              auVar216._12_4_ = 0x7fffffff;
              auVar201 = ZEXT1664(auVar216);
              auVar96 = vandps_avx(auVar96,auVar216);
              if ((float)local_a60._0_4_ <= auVar96._0_4_) {
LAB_00f8065b:
                bVar50 = false;
              }
              else {
                auVar96 = vandps_avx(auVar136,auVar216);
                if ((float)local_820._0_4_ * 1.9073486e-06 + auVar13._0_4_ + (float)local_a60._0_4_
                    <= auVar96._0_4_) goto LAB_00f8065b;
                fVar202 = fVar202 + (float)local_920._0_4_;
                auVar359 = ZEXT464((uint)fVar202);
                bVar50 = true;
                if (((fVar235 <= fVar202) &&
                    (fVar255 = *(float *)(ray + k * 4 + 0x100), fVar202 <= fVar255)) &&
                   ((0.0 <= fVar187 && (fVar187 <= 1.0)))) {
                  auVar137 = vrsqrtss_avx(auVar137,auVar137);
                  fVar203 = auVar137._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar137 = ZEXT416((uint)(fVar203 * 1.5 +
                                             fVar253 * -0.5 * fVar203 * fVar203 * fVar203));
                    auVar137 = vshufps_avx(auVar137,auVar137,0);
                    local_b80 = auVar12._0_4_;
                    fStack_b7c = auVar12._4_4_;
                    fStack_b78 = auVar12._8_4_;
                    fStack_b74 = auVar12._12_4_;
                    auVar138._0_4_ = auVar137._0_4_ * local_b80;
                    auVar138._4_4_ = auVar137._4_4_ * fStack_b7c;
                    auVar138._8_4_ = auVar137._8_4_ * fStack_b78;
                    auVar138._12_4_ = auVar137._12_4_ * fStack_b74;
                    auVar98._0_4_ = auVar266._0_4_ + auVar130._0_4_ * auVar138._0_4_;
                    auVar98._4_4_ = auVar266._4_4_ + auVar130._4_4_ * auVar138._4_4_;
                    auVar98._8_4_ = auVar266._8_4_ + auVar130._8_4_ * auVar138._8_4_;
                    auVar98._12_4_ = auVar266._12_4_ + auVar130._12_4_ * auVar138._12_4_;
                    auVar137 = vshufps_avx(auVar138,auVar138,0xc9);
                    auVar12 = vshufps_avx(auVar266,auVar266,0xc9);
                    auVar139._0_4_ = auVar12._0_4_ * auVar138._0_4_;
                    auVar139._4_4_ = auVar12._4_4_ * auVar138._4_4_;
                    auVar139._8_4_ = auVar12._8_4_ * auVar138._8_4_;
                    auVar139._12_4_ = auVar12._12_4_ * auVar138._12_4_;
                    auVar175._0_4_ = auVar266._0_4_ * auVar137._0_4_;
                    auVar175._4_4_ = auVar266._4_4_ * auVar137._4_4_;
                    auVar175._8_4_ = auVar266._8_4_ * auVar137._8_4_;
                    auVar175._12_4_ = auVar266._12_4_ * auVar137._12_4_;
                    auVar13 = vsubps_avx(auVar175,auVar139);
                    auVar137 = vshufps_avx(auVar13,auVar13,0xc9);
                    auVar12 = vshufps_avx(auVar98,auVar98,0xc9);
                    auVar176._0_4_ = auVar12._0_4_ * auVar137._0_4_;
                    auVar176._4_4_ = auVar12._4_4_ * auVar137._4_4_;
                    auVar176._8_4_ = auVar12._8_4_ * auVar137._8_4_;
                    auVar176._12_4_ = auVar12._12_4_ * auVar137._12_4_;
                    auVar137 = vshufps_avx(auVar13,auVar13,0xd2);
                    auVar99._0_4_ = auVar98._0_4_ * auVar137._0_4_;
                    auVar99._4_4_ = auVar98._4_4_ * auVar137._4_4_;
                    auVar99._8_4_ = auVar98._8_4_ * auVar137._8_4_;
                    auVar99._12_4_ = auVar98._12_4_ * auVar137._12_4_;
                    auVar137 = vsubps_avx(auVar176,auVar99);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar202;
                      uVar1 = vextractps_avx(auVar137,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar137,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar137._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar187;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(uint *)(ray + k * 4 + 0x220) = uVar85;
                      *(uint *)(ray + k * 4 + 0x240) = uVar82;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar6 = context->user;
                      auStack_5b0 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
                      auStack_610 = vshufps_avx(auVar137,auVar137,0x55);
                      auStack_5f0 = vshufps_avx(auVar137,auVar137,0xaa);
                      auStack_5d0 = vshufps_avx(auVar137,auVar137,0);
                      local_620 = (RTCHitN  [16])auStack_610;
                      local_600 = auStack_5f0;
                      local_5e0 = auStack_5d0;
                      local_5c0 = auStack_5b0;
                      local_5a0 = ZEXT832(0) << 0x20;
                      local_580 = local_500._0_8_;
                      uStack_578 = local_500._8_8_;
                      uStack_570 = local_500._16_8_;
                      uStack_568 = local_500._24_8_;
                      local_560 = local_4e0._0_8_;
                      uStack_558 = local_4e0._8_8_;
                      uStack_550 = local_4e0._16_8_;
                      uStack_548 = local_4e0._24_8_;
                      local_a28[1] = local_9a0;
                      *local_a28 = local_9a0;
                      local_540 = pRVar6->instID[0];
                      uStack_53c = local_540;
                      uStack_538 = local_540;
                      uStack_534 = local_540;
                      uStack_530 = local_540;
                      uStack_52c = local_540;
                      uStack_528 = local_540;
                      uStack_524 = local_540;
                      local_520 = pRVar6->instPrimID[0];
                      uStack_51c = local_520;
                      uStack_518 = local_520;
                      uStack_514 = local_520;
                      uStack_510 = local_520;
                      uStack_50c = local_520;
                      uStack_508 = local_520;
                      uStack_504 = local_520;
                      *(float *)(ray + k * 4 + 0x100) = fVar202;
                      local_b40 = *local_a30;
                      uStack_b38 = local_a30[1];
                      local_b30 = *local_a38;
                      uStack_b28 = local_a38[1];
                      local_ad0.valid = (int *)&local_b40;
                      local_ad0.geometryUserPtr = pGVar4->userPtr;
                      local_ad0.context = context->user;
                      local_ad0.hit = local_620;
                      local_ad0.N = 8;
                      local_ad0.ray = (RTCRayN *)ray;
                      if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar4->intersectionFilterN)(&local_ad0);
                      }
                      auVar72._8_8_ = uStack_b38;
                      auVar72._0_8_ = local_b40;
                      auVar137 = vpcmpeqd_avx((undefined1  [16])0x0,auVar72);
                      auVar76._8_8_ = uStack_b28;
                      auVar76._0_8_ = local_b30;
                      auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,auVar76);
                      auVar112._16_16_ = auVar12;
                      auVar112._0_16_ = auVar137;
                      auVar105 = local_9a0 & ~auVar112;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar105 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar105 >> 0x7f,0) == '\0') &&
                            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar105 >> 0xbf,0) == '\0') &&
                          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar105[0x1f]) {
                        auVar113._0_4_ = auVar137._0_4_ ^ local_9a0._0_4_;
                        auVar113._4_4_ = auVar137._4_4_ ^ local_9a0._4_4_;
                        auVar113._8_4_ = auVar137._8_4_ ^ local_9a0._8_4_;
                        auVar113._12_4_ = auVar137._12_4_ ^ local_9a0._12_4_;
                        auVar113._16_4_ = auVar12._0_4_ ^ local_9a0._16_4_;
                        auVar113._20_4_ = auVar12._4_4_ ^ local_9a0._20_4_;
                        auVar113._24_4_ = auVar12._8_4_ ^ local_9a0._24_4_;
                        auVar113._28_4_ = auVar12._12_4_ ^ local_9a0._28_4_;
                        auVar201 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var5 = context->args->filter;
                        auVar201 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var5)(&local_ad0);
                          auVar201 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar73._8_8_ = uStack_b38;
                        auVar73._0_8_ = local_b40;
                        auVar137 = vpcmpeqd_avx((undefined1  [16])0x0,auVar73);
                        auVar77._8_8_ = uStack_b28;
                        auVar77._0_8_ = local_b30;
                        auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,auVar77);
                        auVar156._16_16_ = auVar12;
                        auVar156._0_16_ = auVar137;
                        auVar113._0_4_ = auVar137._0_4_ ^ local_9a0._0_4_;
                        auVar113._4_4_ = auVar137._4_4_ ^ local_9a0._4_4_;
                        auVar113._8_4_ = auVar137._8_4_ ^ local_9a0._8_4_;
                        auVar113._12_4_ = auVar137._12_4_ ^ local_9a0._12_4_;
                        auVar113._16_4_ = auVar12._0_4_ ^ local_9a0._16_4_;
                        auVar113._20_4_ = auVar12._4_4_ ^ local_9a0._20_4_;
                        auVar113._24_4_ = auVar12._8_4_ ^ local_9a0._24_4_;
                        auVar113._28_4_ = auVar12._12_4_ ^ local_9a0._28_4_;
                        auVar105 = local_9a0 & ~auVar156;
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar105 >> 0x7f,0) != '\0')
                              || (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar105 >> 0xbf,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar105[0x1f] < '\0') {
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])local_ad0.hit);
                          *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x20));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x40));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x60));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x80));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x100));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar105;
                        }
                      }
                      auVar359 = ZEXT464((uint)fVar202);
                      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar113 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar113 >> 0x7f,0) == '\0') &&
                            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar113 >> 0xbf,0) == '\0') &&
                          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar113[0x1f]) {
                        *(float *)(ray + k * 4 + 0x100) = fVar255;
                      }
                    }
                  }
                }
              }
              bVar89 = lVar86 != 0;
              lVar86 = lVar86 + -1;
            } while ((!bVar50) && (bVar89));
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar114._4_4_ = uVar1;
            auVar114._0_4_ = uVar1;
            auVar114._8_4_ = uVar1;
            auVar114._12_4_ = uVar1;
            auVar114._16_4_ = uVar1;
            auVar114._20_4_ = uVar1;
            auVar114._24_4_ = uVar1;
            auVar114._28_4_ = uVar1;
            auVar106 = vcmpps_avx(_local_8a0,auVar114,2);
            auVar105 = vandps_avx(auVar106,local_720);
            auVar106 = local_720 & auVar106;
            uVar88 = local_760;
            auVar222 = local_a20;
            local_720 = auVar105;
          } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0x7f,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar106 >> 0xbf,0) != '\0') ||
                   (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar106[0x1f] < '\0');
        }
        auVar115._0_4_ =
             (float)local_8e0._0_4_ * (float)local_840._0_4_ +
             (float)local_900._0_4_ * (float)local_860._0_4_ +
             (float)local_8c0._0_4_ * (float)local_880._0_4_;
        auVar115._4_4_ =
             (float)local_8e0._4_4_ * (float)local_840._4_4_ +
             (float)local_900._4_4_ * (float)local_860._4_4_ +
             (float)local_8c0._4_4_ * (float)local_880._4_4_;
        auVar115._8_4_ = fStack_8d8 * fStack_838 + fStack_8f8 * fStack_858 + fStack_8b8 * fStack_878
        ;
        auVar115._12_4_ =
             fStack_8d4 * fStack_834 + fStack_8f4 * fStack_854 + fStack_8b4 * fStack_874;
        auVar115._16_4_ =
             fStack_8d0 * fStack_830 + fStack_8f0 * fStack_850 + fStack_8b0 * fStack_870;
        auVar115._20_4_ =
             fStack_8cc * fStack_82c + fStack_8ec * fStack_84c + fStack_8ac * fStack_86c;
        auVar115._24_4_ =
             fStack_8c8 * fStack_828 + fStack_8e8 * fStack_848 + fStack_8a8 * fStack_868;
        auVar115._28_4_ = fStack_8c4 + fStack_8e4 + fStack_8a4;
        auVar157._8_4_ = 0x7fffffff;
        auVar157._0_8_ = 0x7fffffff7fffffff;
        auVar157._12_4_ = 0x7fffffff;
        auVar157._16_4_ = 0x7fffffff;
        auVar157._20_4_ = 0x7fffffff;
        auVar157._24_4_ = 0x7fffffff;
        auVar157._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar115,auVar157);
        auVar158._8_4_ = 0x3e99999a;
        auVar158._0_8_ = 0x3e99999a3e99999a;
        auVar158._12_4_ = 0x3e99999a;
        auVar158._16_4_ = 0x3e99999a;
        auVar158._20_4_ = 0x3e99999a;
        auVar158._24_4_ = 0x3e99999a;
        auVar158._28_4_ = 0x3e99999a;
        auVar105 = vcmpps_avx(auVar105,auVar158,1);
        auVar106 = vorps_avx(auVar105,local_700);
        auVar159._0_4_ = auVar222._0_4_ + (float)local_a00._0_4_;
        auVar159._4_4_ = auVar222._4_4_ + (float)local_a00._4_4_;
        auVar159._8_4_ = auVar222._8_4_ + fStack_9f8;
        auVar159._12_4_ = auVar222._12_4_ + fStack_9f4;
        auVar159._16_4_ = auVar222._16_4_ + fStack_9f0;
        auVar159._20_4_ = auVar222._20_4_ + fStack_9ec;
        auVar159._24_4_ = auVar222._24_4_ + fStack_9e8;
        auVar159._28_4_ = auVar222._28_4_ + fStack_9e4;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar182._4_4_ = uVar1;
        auVar182._0_4_ = uVar1;
        auVar182._8_4_ = uVar1;
        auVar182._12_4_ = uVar1;
        auVar182._16_4_ = uVar1;
        auVar182._20_4_ = uVar1;
        auVar182._24_4_ = uVar1;
        auVar182._28_4_ = uVar1;
        auVar105 = vcmpps_avx(auVar159,auVar182,2);
        _local_8e0 = vandps_avx(auVar105,local_6c0);
        auVar160._8_4_ = 3;
        auVar160._0_8_ = 0x300000003;
        auVar160._12_4_ = 3;
        auVar160._16_4_ = 3;
        auVar160._20_4_ = 3;
        auVar160._24_4_ = 3;
        auVar160._28_4_ = 3;
        auVar183._8_4_ = 2;
        auVar183._0_8_ = 0x200000002;
        auVar183._12_4_ = 2;
        auVar183._16_4_ = 2;
        auVar183._20_4_ = 2;
        auVar183._24_4_ = 2;
        auVar183._28_4_ = 2;
        auVar105 = vblendvps_avx(auVar183,auVar160,auVar106);
        auVar137 = vpcmpgtd_avx(auVar105._16_16_,local_7a0);
        auVar12 = vpshufd_avx(local_6e0._0_16_,0);
        auVar12 = vpcmpgtd_avx(auVar105._0_16_,auVar12);
        auVar161._16_16_ = auVar137;
        auVar161._0_16_ = auVar12;
        _local_900 = vblendps_avx(ZEXT1632(auVar12),auVar161,0xf0);
        auVar105 = vandnps_avx(_local_900,_local_8e0);
        auVar106 = _local_8e0 & ~_local_900;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          local_820 = _local_420;
          local_8a0._4_4_ = (float)local_420._4_4_ + (float)local_a00._4_4_;
          local_8a0._0_4_ = (float)local_420._0_4_ + (float)local_a00._0_4_;
          fStack_898 = fStack_418 + fStack_9f8;
          fStack_894 = fStack_414 + fStack_9f4;
          fStack_890 = fStack_410 + fStack_9f0;
          fStack_88c = fStack_40c + fStack_9ec;
          fStack_888 = fStack_408 + fStack_9e8;
          fStack_884 = fStack_404 + fStack_9e4;
          do {
            auVar217 = auVar201._0_16_;
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar162,local_820,auVar105);
            auVar222 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar222 = vminps_avx(auVar106,auVar222);
            auVar146 = vshufpd_avx(auVar222,auVar222,5);
            auVar222 = vminps_avx(auVar222,auVar146);
            auVar146 = vperm2f128_avx(auVar222,auVar222,1);
            auVar222 = vminps_avx(auVar222,auVar146);
            auVar222 = vcmpps_avx(auVar106,auVar222,0);
            auVar146 = auVar105 & auVar222;
            auVar106 = auVar105;
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0x7f,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0xbf,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar146[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar222,auVar105);
            }
            uVar87 = vmovmskps_avx(auVar106);
            uVar7 = 0;
            if (uVar87 != 0) {
              for (; (uVar87 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            uVar88 = (ulong)uVar7;
            local_740 = auVar105;
            *(undefined4 *)(local_740 + uVar88 * 4) = 0;
            fVar187 = local_680[uVar88];
            uVar7 = *(uint *)(local_400 + uVar88 * 4);
            fVar253 = auVar9._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar253 = sqrtf((float)local_9c0._0_4_);
              auVar217._8_4_ = 0x7fffffff;
              auVar217._0_8_ = 0x7fffffff7fffffff;
              auVar217._12_4_ = 0x7fffffff;
            }
            auVar274 = ZEXT464(uVar7);
            auVar12 = vminps_avx(_local_ae0,_local_b00);
            auVar137 = vmaxps_avx(_local_ae0,_local_b00);
            auVar13 = vminps_avx(_local_af0,_local_b10);
            auVar96 = vminps_avx(auVar12,auVar13);
            auVar12 = vmaxps_avx(_local_af0,_local_b10);
            auVar13 = vmaxps_avx(auVar137,auVar12);
            auVar137 = vandps_avx(auVar96,auVar217);
            auVar12 = vandps_avx(auVar13,auVar217);
            auVar137 = vmaxps_avx(auVar137,auVar12);
            auVar12 = vmovshdup_avx(auVar137);
            auVar12 = vmaxss_avx(auVar12,auVar137);
            auVar137 = vshufpd_avx(auVar137,auVar137,1);
            auVar137 = vmaxss_avx(auVar137,auVar12);
            local_aa0._0_4_ = auVar137._0_4_ * 1.9073486e-06;
            local_a60._0_4_ = fVar253 * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar13,auVar13,0xff);
            lVar86 = 4;
            do {
              fVar257 = 1.0 - fVar187;
              auVar137 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
              fVar253 = auVar137._0_4_;
              fVar202 = auVar137._4_4_;
              fVar255 = auVar137._8_4_;
              fVar203 = auVar137._12_4_;
              auVar137 = vshufps_avx(ZEXT416((uint)fVar257),ZEXT416((uint)fVar257),0);
              fVar204 = auVar137._0_4_;
              fVar262 = auVar137._4_4_;
              fVar275 = auVar137._8_4_;
              fVar278 = auVar137._12_4_;
              fVar281 = (float)local_af0._0_4_ * fVar253 + (float)local_b00._0_4_ * fVar204;
              fVar205 = (float)local_af0._4_4_ * fVar202 + (float)local_b00._4_4_ * fVar262;
              fVar206 = fStack_ae8 * fVar255 + fStack_af8 * fVar275;
              fVar207 = fStack_ae4 * fVar203 + fStack_af4 * fVar278;
              auVar242._0_4_ =
                   fVar204 * ((float)local_b00._0_4_ * fVar253 + fVar204 * (float)local_ae0._0_4_) +
                   fVar253 * fVar281;
              auVar242._4_4_ =
                   fVar262 * ((float)local_b00._4_4_ * fVar202 + fVar262 * (float)local_ae0._4_4_) +
                   fVar202 * fVar205;
              auVar242._8_4_ =
                   fVar275 * (fStack_af8 * fVar255 + fVar275 * fStack_ad8) + fVar255 * fVar206;
              auVar242._12_4_ =
                   fVar278 * (fStack_af4 * fVar203 + fVar278 * fStack_ad4) + fVar203 * fVar207;
              auVar193._0_4_ =
                   fVar204 * fVar281 +
                   fVar253 * (fVar253 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar204);
              auVar193._4_4_ =
                   fVar262 * fVar205 +
                   fVar202 * (fVar202 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar262);
              auVar193._8_4_ =
                   fVar275 * fVar206 + fVar255 * (fVar255 * fStack_b08 + fStack_ae8 * fVar275);
              auVar193._12_4_ =
                   fVar278 * fVar207 + fVar203 * (fVar203 * fStack_b04 + fStack_ae4 * fVar278);
              auVar137 = vshufps_avx(auVar274._0_16_,auVar274._0_16_,0);
              auVar140._0_4_ = auVar137._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar140._4_4_ = auVar137._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar140._8_4_ = auVar137._8_4_ * fStack_9a8 + 0.0;
              auVar140._12_4_ = auVar137._12_4_ * fStack_9a4 + 0.0;
              auVar100._0_4_ = fVar204 * auVar242._0_4_ + fVar253 * auVar193._0_4_;
              auVar100._4_4_ = fVar262 * auVar242._4_4_ + fVar202 * auVar193._4_4_;
              auVar100._8_4_ = fVar275 * auVar242._8_4_ + fVar255 * auVar193._8_4_;
              auVar100._12_4_ = fVar278 * auVar242._12_4_ + fVar203 * auVar193._12_4_;
              local_980._0_16_ = auVar100;
              auVar12 = vsubps_avx(auVar140,auVar100);
              auVar137 = vdpps_avx(auVar12,auVar12,0x7f);
              fVar253 = auVar137._0_4_;
              if (fVar253 < 0.0) {
                local_a80._0_16_ = auVar193;
                fVar202 = sqrtf(fVar253);
                auVar193 = local_a80._0_16_;
              }
              else {
                auVar13 = vsqrtss_avx(auVar137,auVar137);
                fVar202 = auVar13._0_4_;
              }
              auVar13 = vsubps_avx(auVar193,auVar242);
              auVar267._0_4_ = auVar13._0_4_ * 3.0;
              auVar267._4_4_ = auVar13._4_4_ * 3.0;
              auVar267._8_4_ = auVar13._8_4_ * 3.0;
              auVar267._12_4_ = auVar13._12_4_ * 3.0;
              auVar13 = vshufps_avx(ZEXT416((uint)(fVar187 * 6.0)),ZEXT416((uint)(fVar187 * 6.0)),0)
              ;
              auVar96 = ZEXT416((uint)((fVar257 - (fVar187 + fVar187)) * 6.0));
              auVar93 = vshufps_avx(auVar96,auVar96,0);
              auVar96 = ZEXT416((uint)((fVar187 - (fVar257 + fVar257)) * 6.0));
              auVar131 = vshufps_avx(auVar96,auVar96,0);
              auVar92 = vshufps_avx(ZEXT416((uint)(fVar257 * 6.0)),ZEXT416((uint)(fVar257 * 6.0)),0)
              ;
              auVar96 = vdpps_avx(auVar267,auVar267,0x7f);
              auVar141._0_4_ =
                   auVar92._0_4_ * (float)local_ae0._0_4_ +
                   auVar131._0_4_ * (float)local_b00._0_4_ +
                   auVar13._0_4_ * (float)local_b10._0_4_ + auVar93._0_4_ * (float)local_af0._0_4_;
              auVar141._4_4_ =
                   auVar92._4_4_ * (float)local_ae0._4_4_ +
                   auVar131._4_4_ * (float)local_b00._4_4_ +
                   auVar13._4_4_ * (float)local_b10._4_4_ + auVar93._4_4_ * (float)local_af0._4_4_;
              auVar141._8_4_ =
                   auVar92._8_4_ * fStack_ad8 +
                   auVar131._8_4_ * fStack_af8 +
                   auVar13._8_4_ * fStack_b08 + auVar93._8_4_ * fStack_ae8;
              auVar141._12_4_ =
                   auVar92._12_4_ * fStack_ad4 +
                   auVar131._12_4_ * fStack_af4 +
                   auVar13._12_4_ * fStack_b04 + auVar93._12_4_ * fStack_ae4;
              auVar13 = vblendps_avx(auVar96,_DAT_01feba10,0xe);
              auVar93 = vrsqrtss_avx(auVar13,auVar13);
              fVar203 = auVar93._0_4_;
              fVar255 = auVar96._0_4_;
              auVar93 = vdpps_avx(auVar267,auVar141,0x7f);
              auVar131 = vshufps_avx(auVar96,auVar96,0);
              auVar142._0_4_ = auVar141._0_4_ * auVar131._0_4_;
              auVar142._4_4_ = auVar141._4_4_ * auVar131._4_4_;
              auVar142._8_4_ = auVar141._8_4_ * auVar131._8_4_;
              auVar142._12_4_ = auVar141._12_4_ * auVar131._12_4_;
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar218._0_4_ = auVar267._0_4_ * auVar93._0_4_;
              auVar218._4_4_ = auVar267._4_4_ * auVar93._4_4_;
              auVar218._8_4_ = auVar267._8_4_ * auVar93._8_4_;
              auVar218._12_4_ = auVar267._12_4_ * auVar93._12_4_;
              auVar92 = vsubps_avx(auVar142,auVar218);
              auVar93 = vrcpss_avx(auVar13,auVar13);
              auVar13 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                   ZEXT416((uint)(auVar274._0_4_ * (float)local_a60._0_4_)));
              auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar255 * auVar93._0_4_)));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              uVar88 = CONCAT44(auVar267._4_4_,auVar267._0_4_);
              auVar243._0_8_ = uVar88 ^ 0x8000000080000000;
              auVar243._8_4_ = -auVar267._8_4_;
              auVar243._12_4_ = -auVar267._12_4_;
              auVar131 = ZEXT416((uint)(fVar203 * 1.5 + fVar255 * -0.5 * fVar203 * fVar203 * fVar203
                                       ));
              auVar131 = vshufps_avx(auVar131,auVar131,0);
              auVar194._0_4_ = auVar131._0_4_ * auVar92._0_4_ * auVar93._0_4_;
              auVar194._4_4_ = auVar131._4_4_ * auVar92._4_4_ * auVar93._4_4_;
              auVar194._8_4_ = auVar131._8_4_ * auVar92._8_4_ * auVar93._8_4_;
              auVar194._12_4_ = auVar131._12_4_ * auVar92._12_4_ * auVar93._12_4_;
              auVar317._0_4_ = auVar267._0_4_ * auVar131._0_4_;
              auVar317._4_4_ = auVar267._4_4_ * auVar131._4_4_;
              auVar317._8_4_ = auVar267._8_4_ * auVar131._8_4_;
              auVar317._12_4_ = auVar267._12_4_ * auVar131._12_4_;
              if (fVar255 < 0.0) {
                local_a80._0_4_ = fVar202;
                local_940._0_16_ = auVar243;
                local_a20._0_16_ = auVar317;
                local_9e0._0_16_ = auVar194;
                fVar255 = sqrtf(fVar255);
                auVar194 = local_9e0._0_16_;
                auVar243 = local_940._0_16_;
                auVar317 = local_a20._0_16_;
                fVar202 = (float)local_a80._0_4_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar255 = auVar96._0_4_;
              }
              auVar96 = vdpps_avx(auVar12,auVar317,0x7f);
              fVar202 = ((float)local_aa0._0_4_ / fVar255) * (fVar202 + 1.0) +
                        auVar13._0_4_ + fVar202 * (float)local_aa0._0_4_;
              auVar93 = vdpps_avx(auVar243,auVar317,0x7f);
              auVar131 = vdpps_avx(auVar12,auVar194,0x7f);
              auVar92 = vdpps_avx(_local_9b0,auVar317,0x7f);
              auVar130 = vdpps_avx(auVar12,auVar243,0x7f);
              fVar255 = auVar93._0_4_ + auVar131._0_4_;
              fVar203 = auVar96._0_4_;
              auVar101._0_4_ = fVar203 * fVar203;
              auVar101._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar101._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar101._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar131 = vsubps_avx(auVar137,auVar101);
              auVar93 = vdpps_avx(auVar12,_local_9b0,0x7f);
              fVar257 = auVar130._0_4_ - fVar203 * fVar255;
              fVar204 = auVar93._0_4_ - fVar203 * auVar92._0_4_;
              auVar93 = vrsqrtss_avx(auVar131,auVar131);
              fVar262 = auVar131._0_4_;
              fVar203 = auVar93._0_4_;
              fVar203 = fVar203 * 1.5 + fVar262 * -0.5 * fVar203 * fVar203 * fVar203;
              if (fVar262 < 0.0) {
                local_a80._0_16_ = auVar96;
                local_940._0_4_ = fVar202;
                local_a20._0_16_ = ZEXT416((uint)fVar255);
                local_9e0._0_16_ = auVar92;
                local_960._0_4_ = fVar257;
                local_7c0._0_4_ = fVar204;
                local_7e0._0_4_ = fVar203;
                fVar262 = sqrtf(fVar262);
                fVar202 = (float)local_940._0_4_;
                fVar203 = (float)local_7e0._0_4_;
                fVar257 = (float)local_960._0_4_;
                fVar204 = (float)local_7c0._0_4_;
                auVar92 = local_9e0._0_16_;
                auVar96 = local_a80._0_16_;
                auVar93 = local_a20._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(auVar131,auVar131);
                fVar262 = auVar93._0_4_;
                auVar93 = ZEXT416((uint)fVar255);
              }
              auVar359 = ZEXT1664(auVar267);
              auVar143 = vpermilps_avx(local_980._0_16_,0xff);
              auVar136 = vshufps_avx(auVar267,auVar267,0xff);
              fVar255 = fVar257 * fVar203 - auVar136._0_4_;
              auVar219._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar219._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar219._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar244._0_4_ = -fVar255;
              auVar244._4_4_ = 0x80000000;
              auVar244._8_4_ = 0x80000000;
              auVar244._12_4_ = 0x80000000;
              auVar131 = vinsertps_avx(ZEXT416((uint)(fVar204 * fVar203)),auVar219,0x10);
              auVar130 = vmovsldup_avx(ZEXT416((uint)(auVar93._0_4_ * fVar204 * fVar203 -
                                                     auVar92._0_4_ * fVar255)));
              auVar131 = vdivps_avx(auVar131,auVar130);
              auVar143 = ZEXT416((uint)(fVar262 - auVar143._0_4_));
              auVar92 = vinsertps_avx(auVar96,auVar143,0x10);
              auVar195._0_4_ = auVar92._0_4_ * auVar131._0_4_;
              auVar195._4_4_ = auVar92._4_4_ * auVar131._4_4_;
              auVar195._8_4_ = auVar92._8_4_ * auVar131._8_4_;
              auVar195._12_4_ = auVar92._12_4_ * auVar131._12_4_;
              auVar93 = vinsertps_avx(auVar244,auVar93,0x1c);
              auVar93 = vdivps_avx(auVar93,auVar130);
              auVar177._0_4_ = auVar92._0_4_ * auVar93._0_4_;
              auVar177._4_4_ = auVar92._4_4_ * auVar93._4_4_;
              auVar177._8_4_ = auVar92._8_4_ * auVar93._8_4_;
              auVar177._12_4_ = auVar92._12_4_ * auVar93._12_4_;
              auVar93 = vhaddps_avx(auVar195,auVar195);
              auVar131 = vhaddps_avx(auVar177,auVar177);
              fVar187 = fVar187 - auVar93._0_4_;
              fVar255 = auVar274._0_4_ - auVar131._0_4_;
              auVar274 = ZEXT464((uint)fVar255);
              auVar220._8_4_ = 0x7fffffff;
              auVar220._0_8_ = 0x7fffffff7fffffff;
              auVar220._12_4_ = 0x7fffffff;
              auVar201 = ZEXT1664(auVar220);
              auVar96 = vandps_avx(auVar96,auVar220);
              if (fVar202 <= auVar96._0_4_) {
LAB_00f812b5:
                bVar50 = false;
              }
              else {
                auVar96 = vandps_avx(auVar143,auVar220);
                if ((float)local_800._0_4_ * 1.9073486e-06 + auVar13._0_4_ + fVar202 <=
                    auVar96._0_4_) goto LAB_00f812b5;
                fVar255 = fVar255 + (float)local_920._0_4_;
                auVar274 = ZEXT464((uint)fVar255);
                bVar50 = true;
                if ((((fVar235 <= fVar255) &&
                     (fVar202 = *(float *)(ray + k * 4 + 0x100), fVar255 <= fVar202)) &&
                    (0.0 <= fVar187)) && (fVar187 <= 1.0)) {
                  auVar137 = vrsqrtss_avx(auVar137,auVar137);
                  fVar203 = auVar137._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar137 = ZEXT416((uint)(fVar203 * 1.5 +
                                             fVar253 * -0.5 * fVar203 * fVar203 * fVar203));
                    auVar137 = vshufps_avx(auVar137,auVar137,0);
                    local_b80 = auVar12._0_4_;
                    fStack_b7c = auVar12._4_4_;
                    fStack_b78 = auVar12._8_4_;
                    fStack_b74 = auVar12._12_4_;
                    auVar144._0_4_ = auVar137._0_4_ * local_b80;
                    auVar144._4_4_ = auVar137._4_4_ * fStack_b7c;
                    auVar144._8_4_ = auVar137._8_4_ * fStack_b78;
                    auVar144._12_4_ = auVar137._12_4_ * fStack_b74;
                    auVar102._0_4_ = auVar267._0_4_ + auVar136._0_4_ * auVar144._0_4_;
                    auVar102._4_4_ = auVar267._4_4_ + auVar136._4_4_ * auVar144._4_4_;
                    auVar102._8_4_ = auVar267._8_4_ + auVar136._8_4_ * auVar144._8_4_;
                    auVar102._12_4_ = auVar267._12_4_ + auVar136._12_4_ * auVar144._12_4_;
                    auVar137 = vshufps_avx(auVar144,auVar144,0xc9);
                    auVar12 = vshufps_avx(auVar267,auVar267,0xc9);
                    auVar145._0_4_ = auVar12._0_4_ * auVar144._0_4_;
                    auVar145._4_4_ = auVar12._4_4_ * auVar144._4_4_;
                    auVar145._8_4_ = auVar12._8_4_ * auVar144._8_4_;
                    auVar145._12_4_ = auVar12._12_4_ * auVar144._12_4_;
                    auVar178._0_4_ = auVar267._0_4_ * auVar137._0_4_;
                    auVar178._4_4_ = auVar267._4_4_ * auVar137._4_4_;
                    auVar178._8_4_ = auVar267._8_4_ * auVar137._8_4_;
                    auVar178._12_4_ = auVar267._12_4_ * auVar137._12_4_;
                    auVar13 = vsubps_avx(auVar178,auVar145);
                    auVar137 = vshufps_avx(auVar13,auVar13,0xc9);
                    auVar12 = vshufps_avx(auVar102,auVar102,0xc9);
                    auVar179._0_4_ = auVar12._0_4_ * auVar137._0_4_;
                    auVar179._4_4_ = auVar12._4_4_ * auVar137._4_4_;
                    auVar179._8_4_ = auVar12._8_4_ * auVar137._8_4_;
                    auVar179._12_4_ = auVar12._12_4_ * auVar137._12_4_;
                    auVar137 = vshufps_avx(auVar13,auVar13,0xd2);
                    auVar103._0_4_ = auVar102._0_4_ * auVar137._0_4_;
                    auVar103._4_4_ = auVar102._4_4_ * auVar137._4_4_;
                    auVar103._8_4_ = auVar102._8_4_ * auVar137._8_4_;
                    auVar103._12_4_ = auVar102._12_4_ * auVar137._12_4_;
                    auVar137 = vsubps_avx(auVar179,auVar103);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar255;
                      uVar1 = vextractps_avx(auVar137,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar137,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar137._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar187;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(uint *)(ray + k * 4 + 0x220) = uVar85;
                      *(uint *)(ray + k * 4 + 0x240) = uVar82;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar6 = context->user;
                      auStack_5b0 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
                      auStack_610 = vshufps_avx(auVar137,auVar137,0x55);
                      auStack_5f0 = vshufps_avx(auVar137,auVar137,0xaa);
                      auStack_5d0 = vshufps_avx(auVar137,auVar137,0);
                      local_620 = (RTCHitN  [16])auStack_610;
                      local_600 = auStack_5f0;
                      local_5e0 = auStack_5d0;
                      local_5c0 = auStack_5b0;
                      local_5a0 = ZEXT832(0) << 0x20;
                      local_580 = local_500._0_8_;
                      uStack_578 = local_500._8_8_;
                      uStack_570 = local_500._16_8_;
                      uStack_568 = local_500._24_8_;
                      local_560 = local_4e0._0_8_;
                      uStack_558 = local_4e0._8_8_;
                      uStack_550 = local_4e0._16_8_;
                      uStack_548 = local_4e0._24_8_;
                      local_a28[1] = local_9a0;
                      *local_a28 = local_9a0;
                      local_540 = pRVar6->instID[0];
                      uStack_53c = local_540;
                      uStack_538 = local_540;
                      uStack_534 = local_540;
                      uStack_530 = local_540;
                      uStack_52c = local_540;
                      uStack_528 = local_540;
                      uStack_524 = local_540;
                      local_520 = pRVar6->instPrimID[0];
                      uStack_51c = local_520;
                      uStack_518 = local_520;
                      uStack_514 = local_520;
                      uStack_510 = local_520;
                      uStack_50c = local_520;
                      uStack_508 = local_520;
                      uStack_504 = local_520;
                      *(float *)(ray + k * 4 + 0x100) = fVar255;
                      local_b40 = *local_a30;
                      uStack_b38 = local_a30[1];
                      local_b30 = *local_a38;
                      uStack_b28 = local_a38[1];
                      local_ad0.valid = (int *)&local_b40;
                      local_ad0.geometryUserPtr = pGVar4->userPtr;
                      local_ad0.context = context->user;
                      local_ad0.hit = local_620;
                      local_ad0.N = 8;
                      local_ad0.ray = (RTCRayN *)ray;
                      if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar359 = ZEXT1664(auVar267);
                        (*pGVar4->intersectionFilterN)(&local_ad0);
                      }
                      auVar74._8_8_ = uStack_b38;
                      auVar74._0_8_ = local_b40;
                      auVar137 = vpcmpeqd_avx((undefined1  [16])0x0,auVar74);
                      auVar78._8_8_ = uStack_b28;
                      auVar78._0_8_ = local_b30;
                      auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,auVar78);
                      auVar116._16_16_ = auVar12;
                      auVar116._0_16_ = auVar137;
                      auVar105 = local_9a0 & ~auVar116;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar105 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar105 >> 0x7f,0) == '\0') &&
                            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar105 >> 0xbf,0) == '\0') &&
                          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar105[0x1f]) {
                        auVar117._0_4_ = auVar137._0_4_ ^ local_9a0._0_4_;
                        auVar117._4_4_ = auVar137._4_4_ ^ local_9a0._4_4_;
                        auVar117._8_4_ = auVar137._8_4_ ^ local_9a0._8_4_;
                        auVar117._12_4_ = auVar137._12_4_ ^ local_9a0._12_4_;
                        auVar117._16_4_ = auVar12._0_4_ ^ local_9a0._16_4_;
                        auVar117._20_4_ = auVar12._4_4_ ^ local_9a0._20_4_;
                        auVar117._24_4_ = auVar12._8_4_ ^ local_9a0._24_4_;
                        auVar117._28_4_ = auVar12._12_4_ ^ local_9a0._28_4_;
                        auVar201 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var5 = context->args->filter;
                        auVar201 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar359 = ZEXT1664(auVar359._0_16_);
                          (*p_Var5)(&local_ad0);
                          auVar201 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar75._8_8_ = uStack_b38;
                        auVar75._0_8_ = local_b40;
                        auVar137 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
                        auVar79._8_8_ = uStack_b28;
                        auVar79._0_8_ = local_b30;
                        auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,auVar79);
                        auVar163._16_16_ = auVar12;
                        auVar163._0_16_ = auVar137;
                        auVar117._0_4_ = auVar137._0_4_ ^ local_9a0._0_4_;
                        auVar117._4_4_ = auVar137._4_4_ ^ local_9a0._4_4_;
                        auVar117._8_4_ = auVar137._8_4_ ^ local_9a0._8_4_;
                        auVar117._12_4_ = auVar137._12_4_ ^ local_9a0._12_4_;
                        auVar117._16_4_ = auVar12._0_4_ ^ local_9a0._16_4_;
                        auVar117._20_4_ = auVar12._4_4_ ^ local_9a0._20_4_;
                        auVar117._24_4_ = auVar12._8_4_ ^ local_9a0._24_4_;
                        auVar117._28_4_ = auVar12._12_4_ ^ local_9a0._28_4_;
                        auVar105 = local_9a0 & ~auVar163;
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar105 >> 0x7f,0) != '\0')
                              || (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar105 >> 0xbf,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar105[0x1f] < '\0') {
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])local_ad0.hit);
                          *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x20));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x40));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x60));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x80));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_ad0.hit + 0x100));
                          *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar105;
                        }
                      }
                      auVar274 = ZEXT464((uint)fVar255);
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar117 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar117 >> 0x7f,0) == '\0') &&
                            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar117 >> 0xbf,0) == '\0') &&
                          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar117[0x1f]) {
                        *(float *)(ray + k * 4 + 0x100) = fVar202;
                      }
                    }
                  }
                }
              }
              bVar89 = lVar86 != 0;
              lVar86 = lVar86 + -1;
            } while ((!bVar50) && (bVar89));
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar118._4_4_ = uVar1;
            auVar118._0_4_ = uVar1;
            auVar118._8_4_ = uVar1;
            auVar118._12_4_ = uVar1;
            auVar118._16_4_ = uVar1;
            auVar118._20_4_ = uVar1;
            auVar118._24_4_ = uVar1;
            auVar118._28_4_ = uVar1;
            auVar106 = vcmpps_avx(_local_8a0,auVar118,2);
            auVar105 = vandps_avx(auVar106,local_740);
            local_740 = local_740 & auVar106;
            uVar88 = local_760;
          } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0x7f,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_740 >> 0xbf,0) != '\0') ||
                   (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_740[0x1f] < '\0');
        }
        auVar105 = vandps_avx(local_6a0,local_780);
        auVar106 = vandps_avx(_local_900,_local_8e0);
        auVar274 = ZEXT3264(_local_a00);
        auVar184._0_4_ = local_a00._0_4_ + local_460._0_4_;
        auVar184._4_4_ = local_a00._4_4_ + local_460._4_4_;
        auVar184._8_4_ = local_a00._8_4_ + local_460._8_4_;
        auVar184._12_4_ = local_a00._12_4_ + local_460._12_4_;
        auVar184._16_4_ = local_a00._16_4_ + local_460._16_4_;
        auVar184._20_4_ = local_a00._20_4_ + local_460._20_4_;
        auVar184._24_4_ = local_a00._24_4_ + local_460._24_4_;
        auVar184._28_4_ = local_a00._28_4_ + local_460._28_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar225._4_4_ = uVar1;
        auVar225._0_4_ = uVar1;
        auVar225._8_4_ = uVar1;
        auVar225._12_4_ = uVar1;
        auVar225._16_4_ = uVar1;
        auVar225._20_4_ = uVar1;
        auVar225._24_4_ = uVar1;
        auVar225._28_4_ = uVar1;
        auVar222 = vcmpps_avx(auVar184,auVar225,2);
        auVar105 = vandps_avx(auVar222,auVar105);
        auVar251._0_4_ = local_a00._0_4_ + local_420._0_4_;
        auVar251._4_4_ = local_a00._4_4_ + local_420._4_4_;
        auVar251._8_4_ = local_a00._8_4_ + local_420._8_4_;
        auVar251._12_4_ = local_a00._12_4_ + local_420._12_4_;
        auVar251._16_4_ = local_a00._16_4_ + local_420._16_4_;
        auVar251._20_4_ = local_a00._20_4_ + local_420._20_4_;
        auVar251._24_4_ = local_a00._24_4_ + local_420._24_4_;
        auVar251._28_4_ = local_a00._28_4_ + local_420._28_4_;
        auVar222 = vcmpps_avx(auVar251,auVar225,2);
        auVar106 = vandps_avx(auVar222,auVar106);
        auVar106 = vorps_avx(auVar105,auVar106);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x60) = auVar106;
          auVar105 = vblendvps_avx(_local_420,_local_460,auVar105);
          *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar105;
          uVar2 = vmovlps_avx(auVar294);
          *(undefined8 *)(afStack_140 + uVar83 * 0x18) = uVar2;
          auStack_138[uVar83 * 0x18] = (int)uVar88 + 1;
          uVar83 = (ulong)((int)uVar83 + 1);
          goto LAB_00f7fd9e;
        }
        auVar222._8_4_ = 0x3f800000;
        auVar222._0_8_ = &DAT_3f8000003f800000;
        auVar222._12_4_ = 0x3f800000;
        auVar222._16_4_ = 0x3f800000;
        auVar222._20_4_ = 0x3f800000;
        auVar222._24_4_ = 0x3f800000;
        auVar222._28_4_ = 0x3f800000;
      }
    }
    auVar301 = ZEXT1664(auVar294);
    do {
      if ((int)uVar83 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar104._4_4_ = uVar1;
        auVar104._0_4_ = uVar1;
        auVar104._8_4_ = uVar1;
        auVar104._12_4_ = uVar1;
        auVar132 = vcmpps_avx(local_630,auVar104,2);
        uVar82 = vmovmskps_avx(auVar132);
        uVar82 = (uint)local_908 & uVar82;
        if (uVar82 == 0) {
          return;
        }
        goto LAB_00f7eb5d;
      }
      uVar84 = (ulong)((int)uVar83 - 1);
      lVar86 = uVar84 * 0x60;
      auVar105 = *(undefined1 (*) [32])(auStack_160 + lVar86);
      auVar110._0_4_ = auVar274._0_4_ + auVar105._0_4_;
      auVar110._4_4_ = auVar274._4_4_ + auVar105._4_4_;
      auVar110._8_4_ = auVar274._8_4_ + auVar105._8_4_;
      auVar110._12_4_ = auVar274._12_4_ + auVar105._12_4_;
      auVar110._16_4_ = auVar274._16_4_ + auVar105._16_4_;
      auVar110._20_4_ = auVar274._20_4_ + auVar105._20_4_;
      auVar110._24_4_ = auVar274._24_4_ + auVar105._24_4_;
      auVar110._28_4_ = auVar274._28_4_ + auVar105._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar199._4_4_ = uVar1;
      auVar199._0_4_ = uVar1;
      auVar199._8_4_ = uVar1;
      auVar199._12_4_ = uVar1;
      auVar199._16_4_ = uVar1;
      auVar199._20_4_ = uVar1;
      auVar199._24_4_ = uVar1;
      auVar199._28_4_ = uVar1;
      auVar146 = vcmpps_avx(auVar110,auVar199,2);
      auVar106 = vandps_avx(auVar146,*(undefined1 (*) [32])(auStack_180 + lVar86));
      _local_620 = auVar106;
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar86) & auVar146;
      bVar68 = (auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar69 = (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar67 = (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = SUB321(auVar14 >> 0x7f,0) == '\0';
      bVar65 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar64 = SUB321(auVar14 >> 0xbf,0) == '\0';
      bVar89 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar50 = -1 < auVar14[0x1f];
      if (((((((!bVar68 || !bVar69) || !bVar67) || !bVar66) || !bVar65) || !bVar64) || !bVar89) ||
          !bVar50) {
        auVar180._8_4_ = 0x7f800000;
        auVar180._0_8_ = 0x7f8000007f800000;
        auVar180._12_4_ = 0x7f800000;
        auVar180._16_4_ = 0x7f800000;
        auVar180._20_4_ = 0x7f800000;
        auVar180._24_4_ = 0x7f800000;
        auVar180._28_4_ = 0x7f800000;
        auVar105 = vblendvps_avx(auVar180,auVar105,auVar106);
        auVar146 = vshufps_avx(auVar105,auVar105,0xb1);
        auVar146 = vminps_avx(auVar105,auVar146);
        auVar14 = vshufpd_avx(auVar146,auVar146,5);
        auVar14 = vminps_avx(auVar146,auVar14);
        auVar146 = vperm2f128_avx(auVar14,auVar14,1);
        auVar14 = vminps_avx(auVar14,auVar146);
        auVar105 = vcmpps_avx(auVar105,auVar14,0);
        auVar14 = auVar106 & auVar105;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar106 = vandps_avx(auVar105,auVar106);
        }
        fVar187 = afStack_140[uVar84 * 0x18 + 1];
        uVar88 = (ulong)auStack_138[uVar84 * 0x18];
        uVar87 = vmovmskps_avx(auVar106);
        uVar7 = 0;
        if (uVar87 != 0) {
          for (; (uVar87 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        fVar253 = afStack_140[uVar84 * 0x18];
        *(undefined4 *)(local_620 + (ulong)uVar7 * 4) = 0;
        if ((((((((_local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_620 >> 0x7f,0) != '\0') ||
              (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_620 >> 0xbf,0) != '\0') ||
            (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_620[0x1f] < '\0') {
          uVar84 = uVar83;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar86) = _local_620;
        auVar137 = vshufps_avx(ZEXT416((uint)(fVar187 - fVar253)),ZEXT416((uint)(fVar187 - fVar253))
                               ,0);
        local_460._4_4_ = fVar253 + auVar137._4_4_ * 0.14285715;
        local_460._0_4_ = fVar253 + auVar137._0_4_ * 0.0;
        fStack_458 = fVar253 + auVar137._8_4_ * 0.2857143;
        fStack_454 = fVar253 + auVar137._12_4_ * 0.42857146;
        fStack_450 = fVar253 + auVar137._0_4_ * 0.5714286;
        fStack_44c = fVar253 + auVar137._4_4_ * 0.71428573;
        fStack_448 = fVar253 + auVar137._8_4_ * 0.8571429;
        fStack_444 = fVar253 + auVar137._12_4_;
        auVar301 = ZEXT864(*(ulong *)(local_460 + (ulong)uVar7 * 4));
      }
      uVar83 = uVar84;
      auVar201 = ZEXT3264(auVar146);
    } while (((((((bVar68 && bVar69) && bVar67) && bVar66) && bVar65) && bVar64) && bVar89) &&
             bVar50);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }